

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  int iVar81;
  float fVar82;
  undefined4 uVar83;
  float fVar87;
  float fVar88;
  vint4 bi_2;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  vint4 bi;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  vint4 ai_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  __m128 a_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  __m128 a;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar181;
  float fVar192;
  float fVar194;
  float fVar196;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar193;
  float fVar195;
  float fVar197;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  vfloat4 a0_1;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar209;
  float fVar216;
  float fVar217;
  vfloat4 a0;
  undefined1 auVar210 [16];
  float fVar218;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  long local_328;
  Primitive *local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  RayQueryContext *local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  RTCFilterFunctionNArguments local_2a8;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint auStack_158 [4];
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_13c;
  undefined4 local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint uStack_b8;
  float afStack_b4 [7];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  
  PVar4 = prim[1];
  uVar21 = (ulong)(byte)PVar4;
  fVar200 = *(float *)(prim + uVar21 * 0x19 + 0x12);
  auVar31 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar21 * 0x19 + 6));
  auVar45._0_4_ = fVar200 * (ray->dir).field_0.m128[0];
  auVar45._4_4_ = fVar200 * (ray->dir).field_0.m128[1];
  auVar45._8_4_ = fVar200 * (ray->dir).field_0.m128[2];
  auVar45._12_4_ = fVar200 * (ray->dir).field_0.m128[3];
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 4 + 6)));
  auVar138._0_4_ = fVar200 * auVar31._0_4_;
  auVar138._4_4_ = fVar200 * auVar31._4_4_;
  auVar138._8_4_ = fVar200 * auVar31._8_4_;
  auVar138._12_4_ = fVar200 * auVar31._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 5 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 6 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0xb + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar21 + 6)));
  uVar24 = (ulong)(uint)((int)(uVar21 * 9) * 2);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 + uVar21 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  uVar22 = (ulong)(uint)((int)(uVar21 * 5) << 2);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar222._4_4_ = auVar45._0_4_;
  auVar222._0_4_ = auVar45._0_4_;
  auVar222._8_4_ = auVar45._0_4_;
  auVar222._12_4_ = auVar45._0_4_;
  auVar37 = vshufps_avx(auVar45,auVar45,0x55);
  auVar39 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar200 = auVar39._0_4_;
  auVar119._0_4_ = fVar200 * auVar32._0_4_;
  fVar181 = auVar39._4_4_;
  auVar119._4_4_ = fVar181 * auVar32._4_4_;
  fVar193 = auVar39._8_4_;
  auVar119._8_4_ = fVar193 * auVar32._8_4_;
  fVar195 = auVar39._12_4_;
  auVar119._12_4_ = fVar195 * auVar32._12_4_;
  auVar48._0_4_ = auVar34._0_4_ * fVar200;
  auVar48._4_4_ = auVar34._4_4_ * fVar181;
  auVar48._8_4_ = auVar34._8_4_ * fVar193;
  auVar48._12_4_ = auVar34._12_4_ * fVar195;
  auVar43._0_4_ = auVar36._0_4_ * fVar200;
  auVar43._4_4_ = auVar36._4_4_ * fVar181;
  auVar43._8_4_ = auVar36._8_4_ * fVar193;
  auVar43._12_4_ = auVar36._12_4_ * fVar195;
  auVar39 = vfmadd231ps_fma(auVar119,auVar37,auVar31);
  auVar40 = vfmadd231ps_fma(auVar48,auVar37,auVar38);
  auVar37 = vfmadd231ps_fma(auVar43,auVar35,auVar37);
  auVar41 = vfmadd231ps_fma(auVar39,auVar222,auVar30);
  auVar40 = vfmadd231ps_fma(auVar40,auVar222,auVar42);
  auVar43 = vfmadd231ps_fma(auVar37,auVar33,auVar222);
  auVar223._4_4_ = auVar138._0_4_;
  auVar223._0_4_ = auVar138._0_4_;
  auVar223._8_4_ = auVar138._0_4_;
  auVar223._12_4_ = auVar138._0_4_;
  auVar37 = vshufps_avx(auVar138,auVar138,0x55);
  auVar39 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar200 = auVar39._0_4_;
  auVar139._0_4_ = fVar200 * auVar32._0_4_;
  fVar181 = auVar39._4_4_;
  auVar139._4_4_ = fVar181 * auVar32._4_4_;
  fVar193 = auVar39._8_4_;
  auVar139._8_4_ = fVar193 * auVar32._8_4_;
  fVar195 = auVar39._12_4_;
  auVar139._12_4_ = fVar195 * auVar32._12_4_;
  auVar47._0_4_ = auVar34._0_4_ * fVar200;
  auVar47._4_4_ = auVar34._4_4_ * fVar181;
  auVar47._8_4_ = auVar34._8_4_ * fVar193;
  auVar47._12_4_ = auVar34._12_4_ * fVar195;
  auVar46._0_4_ = auVar36._0_4_ * fVar200;
  auVar46._4_4_ = auVar36._4_4_ * fVar181;
  auVar46._8_4_ = auVar36._8_4_ * fVar193;
  auVar46._12_4_ = auVar36._12_4_ * fVar195;
  auVar31 = vfmadd231ps_fma(auVar139,auVar37,auVar31);
  auVar32 = vfmadd231ps_fma(auVar47,auVar37,auVar38);
  auVar38 = vfmadd231ps_fma(auVar46,auVar37,auVar35);
  auVar34 = vfmadd231ps_fma(auVar31,auVar223,auVar30);
  auVar35 = vfmadd231ps_fma(auVar32,auVar223,auVar42);
  auVar36 = vfmadd231ps_fma(auVar38,auVar223,auVar33);
  auVar66._16_16_ = in_YmmResult._16_16_;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar233 = ZEXT1664(auVar30);
  auVar31 = vandps_avx512vl(auVar41,auVar30);
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  uVar24 = vcmpps_avx512vl(auVar31,auVar149,1);
  bVar29 = (bool)((byte)uVar24 & 1);
  auVar39._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar41._0_4_;
  bVar29 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar41._4_4_;
  bVar29 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar41._8_4_;
  bVar29 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar41._12_4_;
  auVar31 = vandps_avx512vl(auVar40,auVar30);
  uVar24 = vcmpps_avx512vl(auVar31,auVar149,1);
  bVar29 = (bool)((byte)uVar24 & 1);
  auVar41._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._0_4_;
  bVar29 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._4_4_;
  bVar29 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._8_4_;
  bVar29 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar40._12_4_;
  auVar30 = vandps_avx512vl(auVar43,auVar30);
  uVar24 = vcmpps_avx512vl(auVar30,auVar149,1);
  bVar29 = (bool)((byte)uVar24 & 1);
  auVar40._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._0_4_;
  bVar29 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._4_4_;
  bVar29 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._8_4_;
  bVar29 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar43._12_4_;
  auVar30 = vrcp14ps_avx512vl(auVar39);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar234 = ZEXT1664(auVar31);
  auVar32 = vfnmadd213ps_avx512vl(auVar39,auVar30,auVar31);
  auVar42 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar41);
  auVar32 = vfnmadd213ps_avx512vl(auVar41,auVar30,auVar31);
  auVar38 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar40);
  auVar31 = vfnmadd213ps_avx512vl(auVar40,auVar30,auVar31);
  auVar33 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar21 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar32 = vsubps_avx(auVar30,auVar34);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar21 * 9 + 6);
  auVar30 = vpmovsxwd_avx(auVar31);
  auVar128._0_4_ = auVar42._0_4_ * auVar32._0_4_;
  auVar128._4_4_ = auVar42._4_4_ * auVar32._4_4_;
  auVar128._8_4_ = auVar42._8_4_ * auVar32._8_4_;
  auVar128._12_4_ = auVar42._12_4_ * auVar32._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar34);
  auVar120._0_4_ = auVar42._0_4_ * auVar30._0_4_;
  auVar120._4_4_ = auVar42._4_4_ * auVar30._4_4_;
  auVar120._8_4_ = auVar42._8_4_ * auVar30._8_4_;
  auVar120._12_4_ = auVar42._12_4_ * auVar30._12_4_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar31 = vpmovsxwd_avx(auVar32);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar21 * -2 + 6);
  auVar30 = vpmovsxwd_avx(auVar42);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar35);
  auVar150._0_4_ = auVar38._0_4_ * auVar30._0_4_;
  auVar150._4_4_ = auVar38._4_4_ * auVar30._4_4_;
  auVar150._8_4_ = auVar38._8_4_ * auVar30._8_4_;
  auVar150._12_4_ = auVar38._12_4_ * auVar30._12_4_;
  auVar30 = vcvtdq2ps_avx(auVar31);
  auVar30 = vsubps_avx(auVar30,auVar35);
  auVar90._0_4_ = auVar38._0_4_ * auVar30._0_4_;
  auVar90._4_4_ = auVar38._4_4_ * auVar30._4_4_;
  auVar90._8_4_ = auVar38._8_4_ * auVar30._8_4_;
  auVar90._12_4_ = auVar38._12_4_ * auVar30._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar22 + uVar21 + 6);
  auVar30 = vpmovsxwd_avx(auVar38);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar36);
  auVar109._0_4_ = auVar33._0_4_ * auVar30._0_4_;
  auVar109._4_4_ = auVar33._4_4_ * auVar30._4_4_;
  auVar109._8_4_ = auVar33._8_4_ * auVar30._8_4_;
  auVar109._12_4_ = auVar33._12_4_ * auVar30._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar21 * 0x17 + 6);
  auVar30 = vpmovsxwd_avx(auVar34);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar36);
  auVar44._0_4_ = auVar33._0_4_ * auVar30._0_4_;
  auVar44._4_4_ = auVar33._4_4_ * auVar30._4_4_;
  auVar44._8_4_ = auVar33._8_4_ * auVar30._8_4_;
  auVar44._12_4_ = auVar33._12_4_ * auVar30._12_4_;
  auVar30 = vpminsd_avx(auVar128,auVar120);
  auVar31 = vpminsd_avx(auVar150,auVar90);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar31 = vpminsd_avx(auVar109,auVar44);
  uVar83 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar33._4_4_ = uVar83;
  auVar33._0_4_ = uVar83;
  auVar33._8_4_ = uVar83;
  auVar33._12_4_ = uVar83;
  auVar31 = vmaxps_avx512vl(auVar31,auVar33);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar35._8_4_ = 0x3f7ffffa;
  auVar35._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar35._12_4_ = 0x3f7ffffa;
  local_d8 = vmulps_avx512vl(auVar30,auVar35);
  auVar30 = vpmaxsd_avx(auVar128,auVar120);
  auVar31 = vpmaxsd_avx(auVar150,auVar90);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar31 = vpmaxsd_avx(auVar109,auVar44);
  fVar200 = ray->tfar;
  auVar36._4_4_ = fVar200;
  auVar36._0_4_ = fVar200;
  auVar36._8_4_ = fVar200;
  auVar36._12_4_ = fVar200;
  auVar31 = vminps_avx512vl(auVar31,auVar36);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar37._8_4_ = 0x3f800003;
  auVar37._0_8_ = 0x3f8000033f800003;
  auVar37._12_4_ = 0x3f800003;
  auVar30 = vmulps_avx512vl(auVar30,auVar37);
  auVar31 = vpbroadcastd_avx512vl();
  uVar11 = vcmpps_avx512vl(local_d8,auVar30,2);
  local_2b0 = vpcmpgtd_avx512vl(auVar31,_DAT_01ff0cf0);
  local_2b0 = ((byte)uVar11 & 0xf) & local_2b0;
  bVar28 = (char)local_2b0 == '\0';
  bVar29 = !bVar28;
  if (bVar28) {
    return bVar29;
  }
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar237 = ZEXT1664(auVar30);
  local_320 = prim;
LAB_01b38de7:
  lVar25 = 0;
  for (uVar24 = local_2b0; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar27 = *(uint *)(local_320 + 2);
  local_2b8 = (ulong)*(uint *)(local_320 + lVar25 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar27].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_2b8 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar30 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar24);
  lVar25 = uVar24 + 1;
  auVar31 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar25);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar32 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar24);
  auVar42 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar25);
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar34 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar24),
                       auVar30,auVar33);
  auVar35 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar25),
                       auVar31,auVar33);
  auVar36 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar24 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar32,auVar33);
  auVar37 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar25),
                       auVar42,auVar33);
  auVar63._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar38 = vmulps_avx512vl(auVar31,auVar63._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar63._0_16_);
  auVar38 = vfmadd213ps_fma((undefined1  [16])0x0,auVar34,auVar39);
  auVar91._0_4_ = auVar30._0_4_ + auVar38._0_4_;
  auVar91._4_4_ = auVar30._4_4_ + auVar38._4_4_;
  auVar91._8_4_ = auVar30._8_4_ + auVar38._8_4_;
  auVar91._12_4_ = auVar30._12_4_ + auVar38._12_4_;
  auVar43 = auVar237._0_16_;
  auVar38 = vfmadd231ps_avx512vl(auVar39,auVar34,auVar43);
  auVar39 = vfnmadd231ps_avx512vl(auVar38,auVar30,auVar43);
  auVar38 = vmulps_avx512vl(auVar42,auVar63._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar38,auVar37,auVar63._0_16_);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar36,auVar40);
  auVar210._0_4_ = auVar32._0_4_ + auVar38._0_4_;
  auVar210._4_4_ = auVar32._4_4_ + auVar38._4_4_;
  auVar210._8_4_ = auVar32._8_4_ + auVar38._8_4_;
  auVar210._12_4_ = auVar32._12_4_ + auVar38._12_4_;
  auVar38 = vfmadd231ps_avx512vl(auVar40,auVar36,auVar43);
  auVar40 = vfnmadd231ps_avx512vl(auVar38,auVar32,auVar43);
  auVar38 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar35,auVar31);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar34,auVar63._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar38,auVar30,auVar63._0_16_);
  auVar31 = vmulps_avx512vl(auVar31,auVar43);
  auVar31 = vfnmadd231ps_avx512vl(auVar31,auVar43,auVar35);
  auVar31 = vfmadd231ps_avx512vl(auVar31,auVar63._0_16_,auVar34);
  auVar35 = vfnmadd231ps_avx512vl(auVar31,auVar63._0_16_,auVar30);
  auVar30 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar37,auVar42);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar36,auVar63._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar30,auVar32,auVar63._0_16_);
  auVar30 = vmulps_avx512vl(auVar42,auVar43);
  auVar30 = vfnmadd231ps_avx512vl(auVar30,auVar43,auVar37);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar63._0_16_,auVar36);
  auVar34 = vfnmadd231ps_avx512vl(auVar30,auVar63._0_16_,auVar32);
  auVar30 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar31 = vshufps_avx(auVar210,auVar210,0xc9);
  fVar82 = auVar39._0_4_;
  auVar140._0_4_ = fVar82 * auVar31._0_4_;
  fVar87 = auVar39._4_4_;
  auVar140._4_4_ = fVar87 * auVar31._4_4_;
  fVar88 = auVar39._8_4_;
  auVar140._8_4_ = fVar88 * auVar31._8_4_;
  fVar89 = auVar39._12_4_;
  auVar140._12_4_ = fVar89 * auVar31._12_4_;
  auVar31 = vfmsub231ps_fma(auVar140,auVar30,auVar210);
  auVar32 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar162._0_4_ = auVar31._0_4_ * fVar82;
  auVar162._4_4_ = auVar31._4_4_ * fVar87;
  auVar162._8_4_ = auVar31._8_4_ * fVar88;
  auVar162._12_4_ = auVar31._12_4_ * fVar89;
  auVar30 = vfmsub231ps_fma(auVar162,auVar30,auVar40);
  auVar42 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar31 = vshufps_avx(auVar38,auVar38,0xc9);
  fVar200 = auVar35._0_4_;
  auVar172._0_4_ = auVar31._0_4_ * fVar200;
  fVar181 = auVar35._4_4_;
  auVar172._4_4_ = auVar31._4_4_ * fVar181;
  fVar193 = auVar35._8_4_;
  auVar172._8_4_ = auVar31._8_4_ * fVar193;
  fVar195 = auVar35._12_4_;
  auVar172._12_4_ = auVar31._12_4_ * fVar195;
  auVar31 = vfmsub231ps_fma(auVar172,auVar30,auVar38);
  auVar38 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar173._0_4_ = auVar31._0_4_ * fVar200;
  auVar173._4_4_ = auVar31._4_4_ * fVar181;
  auVar173._8_4_ = auVar31._8_4_ * fVar193;
  auVar173._12_4_ = auVar31._12_4_ * fVar195;
  auVar30 = vfmsub231ps_fma(auVar173,auVar30,auVar34);
  auVar34 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vdpps_avx(auVar32,auVar32,0x7f);
  fVar197 = auVar30._0_4_;
  auVar63._16_16_ = auVar66._16_16_;
  auVar49._4_28_ = auVar63._4_28_;
  auVar49._0_4_ = fVar197;
  auVar31 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar49._0_16_);
  auVar36 = vmulss_avx512f(auVar31,ZEXT416(0x3fc00000));
  fVar198 = auVar31._0_4_;
  fVar199 = auVar36._0_4_ - fVar197 * 0.5 * fVar198 * fVar198 * fVar198;
  auVar31 = vdpps_avx(auVar32,auVar42,0x7f);
  fVar209 = fVar199 * auVar32._0_4_;
  fVar216 = fVar199 * auVar32._4_4_;
  fVar217 = fVar199 * auVar32._8_4_;
  fVar218 = fVar199 * auVar32._12_4_;
  auVar163._0_4_ = fVar197 * auVar42._0_4_;
  auVar163._4_4_ = fVar197 * auVar42._4_4_;
  auVar163._8_4_ = fVar197 * auVar42._8_4_;
  auVar163._12_4_ = fVar197 * auVar42._12_4_;
  fVar197 = auVar31._0_4_;
  auVar141._0_4_ = fVar197 * auVar32._0_4_;
  auVar141._4_4_ = fVar197 * auVar32._4_4_;
  auVar141._8_4_ = fVar197 * auVar32._8_4_;
  auVar141._12_4_ = fVar197 * auVar32._12_4_;
  auVar32 = vsubps_avx(auVar163,auVar141);
  auVar31 = vrcp14ss_avx512f(auVar63._0_16_,auVar49._0_16_);
  auVar30 = vfnmadd213ss_fma(auVar30,auVar31,SUB6416(ZEXT464(0x40000000),0));
  fVar197 = auVar31._0_4_ * auVar30._0_4_;
  auVar30 = vdpps_avx(auVar38,auVar38,0x7f);
  fVar198 = auVar30._0_4_;
  auVar64._16_16_ = auVar66._16_16_;
  auVar64._0_16_ = auVar63._0_16_;
  auVar65._4_28_ = auVar64._4_28_;
  auVar65._0_4_ = fVar198;
  auVar31 = vrsqrt14ss_avx512f(auVar63._0_16_,auVar65._0_16_);
  auVar42 = vmulss_avx512f(auVar31,ZEXT416(0x3fc00000));
  fVar148 = auVar31._0_4_;
  fVar148 = auVar42._0_4_ - fVar198 * 0.5 * fVar148 * fVar148 * fVar148;
  fVar180 = fVar148 * auVar38._0_4_;
  fVar192 = fVar148 * auVar38._4_4_;
  fVar194 = fVar148 * auVar38._8_4_;
  fVar196 = fVar148 * auVar38._12_4_;
  auVar31 = vdpps_avx(auVar38,auVar34,0x7f);
  auVar129._0_4_ = fVar198 * auVar34._0_4_;
  auVar129._4_4_ = fVar198 * auVar34._4_4_;
  auVar129._8_4_ = fVar198 * auVar34._8_4_;
  auVar129._12_4_ = fVar198 * auVar34._12_4_;
  fVar198 = auVar31._0_4_;
  auVar121._0_4_ = fVar198 * auVar38._0_4_;
  auVar121._4_4_ = fVar198 * auVar38._4_4_;
  auVar121._8_4_ = fVar198 * auVar38._8_4_;
  auVar121._12_4_ = fVar198 * auVar38._12_4_;
  auVar42 = vsubps_avx(auVar129,auVar121);
  auVar31 = vrcp14ss_avx512f(auVar63._0_16_,auVar65._0_16_);
  auVar30 = vfnmadd213ss_fma(auVar30,auVar31,SUB6416(ZEXT464(0x40000000),0));
  fVar198 = auVar31._0_4_ * auVar30._0_4_;
  auVar30 = vshufps_avx(auVar91,auVar91,0xff);
  auVar151._0_4_ = fVar209 * auVar30._0_4_;
  auVar151._4_4_ = fVar216 * auVar30._4_4_;
  auVar151._8_4_ = fVar217 * auVar30._8_4_;
  auVar151._12_4_ = fVar218 * auVar30._12_4_;
  local_208 = vsubps_avx(auVar91,auVar151);
  auVar31 = vshufps_avx(auVar39,auVar39,0xff);
  auVar130._0_4_ = auVar31._0_4_ * fVar209 + auVar30._0_4_ * fVar199 * fVar197 * auVar32._0_4_;
  auVar130._4_4_ = auVar31._4_4_ * fVar216 + auVar30._4_4_ * fVar199 * fVar197 * auVar32._4_4_;
  auVar130._8_4_ = auVar31._8_4_ * fVar217 + auVar30._8_4_ * fVar199 * fVar197 * auVar32._8_4_;
  auVar130._12_4_ = auVar31._12_4_ * fVar218 + auVar30._12_4_ * fVar199 * fVar197 * auVar32._12_4_;
  auVar32 = vsubps_avx(auVar39,auVar130);
  local_218._0_4_ = auVar91._0_4_ + auVar151._0_4_;
  local_218._4_4_ = auVar91._4_4_ + auVar151._4_4_;
  fStack_210 = auVar91._8_4_ + auVar151._8_4_;
  fStack_20c = auVar91._12_4_ + auVar151._12_4_;
  auVar84._0_4_ = fVar82 + auVar130._0_4_;
  auVar84._4_4_ = fVar87 + auVar130._4_4_;
  auVar84._8_4_ = fVar88 + auVar130._8_4_;
  auVar84._12_4_ = fVar89 + auVar130._12_4_;
  auVar30 = vshufps_avx(auVar41,auVar41,0xff);
  auVar131._0_4_ = fVar180 * auVar30._0_4_;
  auVar131._4_4_ = fVar192 * auVar30._4_4_;
  auVar131._8_4_ = fVar194 * auVar30._8_4_;
  auVar131._12_4_ = fVar196 * auVar30._12_4_;
  local_228 = vsubps_avx(auVar41,auVar131);
  auVar31 = vshufps_avx(auVar35,auVar35,0xff);
  auVar92._0_4_ = fVar180 * auVar31._0_4_ + auVar30._0_4_ * fVar148 * auVar42._0_4_ * fVar198;
  auVar92._4_4_ = fVar192 * auVar31._4_4_ + auVar30._4_4_ * fVar148 * auVar42._4_4_ * fVar198;
  auVar92._8_4_ = fVar194 * auVar31._8_4_ + auVar30._8_4_ * fVar148 * auVar42._8_4_ * fVar198;
  auVar92._12_4_ = fVar196 * auVar31._12_4_ + auVar30._12_4_ * fVar148 * auVar42._12_4_ * fVar198;
  auVar30 = vsubps_avx(auVar35,auVar92);
  _local_238 = vaddps_avx512vl(auVar41,auVar131);
  auVar93._0_4_ = fVar200 + auVar92._0_4_;
  auVar93._4_4_ = fVar181 + auVar92._4_4_;
  auVar93._8_4_ = fVar193 + auVar92._8_4_;
  auVar93._12_4_ = fVar195 + auVar92._12_4_;
  auVar31 = vmulps_avx512vl(auVar32,auVar33);
  local_248 = vaddps_avx512vl(local_208,auVar31);
  auVar30 = vmulps_avx512vl(auVar30,auVar33);
  local_258 = vsubps_avx512vl(local_228,auVar30);
  auVar30 = vmulps_avx512vl(auVar84,auVar33);
  _local_268 = vaddps_avx512vl(_local_218,auVar30);
  auVar30 = vmulps_avx512vl(auVar93,auVar33);
  _local_278 = vsubps_avx512vl(_local_238,auVar30);
  aVar1 = (ray->org).field_0;
  auVar31 = vsubps_avx(local_208,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar94._4_4_ = uVar83;
  auVar94._0_4_ = uVar83;
  auVar94._8_4_ = uVar83;
  auVar94._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  fVar200 = (pre->ray_space).vz.field_0.m128[0];
  fVar181 = (pre->ray_space).vz.field_0.m128[1];
  fVar193 = (pre->ray_space).vz.field_0.m128[2];
  fVar195 = (pre->ray_space).vz.field_0.m128[3];
  auVar85._0_4_ = fVar200 * auVar31._0_4_;
  auVar85._4_4_ = fVar181 * auVar31._4_4_;
  auVar85._8_4_ = fVar193 * auVar31._8_4_;
  auVar85._12_4_ = fVar195 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar3,auVar30);
  auVar38 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar94);
  auVar31 = vsubps_avx512vl(local_248,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar103._4_4_ = uVar83;
  auVar103._0_4_ = uVar83;
  auVar103._8_4_ = uVar83;
  auVar103._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar95._0_4_ = fVar200 * auVar31._0_4_;
  auVar95._4_4_ = fVar181 * auVar31._4_4_;
  auVar95._8_4_ = fVar193 * auVar31._8_4_;
  auVar95._12_4_ = fVar195 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar30);
  auVar34 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar103);
  auVar31 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar142._4_4_ = uVar83;
  auVar142._0_4_ = uVar83;
  auVar142._8_4_ = uVar83;
  auVar142._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar104._0_4_ = fVar200 * auVar31._0_4_;
  auVar104._4_4_ = fVar181 * auVar31._4_4_;
  auVar104._8_4_ = fVar193 * auVar31._8_4_;
  auVar104._12_4_ = fVar195 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar30);
  auVar33 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar142);
  auVar31 = vsubps_avx(local_228,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar164._4_4_ = uVar83;
  auVar164._0_4_ = uVar83;
  auVar164._8_4_ = uVar83;
  auVar164._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar143._0_4_ = fVar200 * auVar31._0_4_;
  auVar143._4_4_ = fVar181 * auVar31._4_4_;
  auVar143._8_4_ = fVar193 * auVar31._8_4_;
  auVar143._12_4_ = fVar195 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar3,auVar30);
  auVar35 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar164);
  auVar31 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar174._4_4_ = uVar83;
  auVar174._0_4_ = uVar83;
  auVar174._8_4_ = uVar83;
  auVar174._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar165._0_4_ = auVar31._0_4_ * fVar200;
  auVar165._4_4_ = auVar31._4_4_ * fVar181;
  auVar165._8_4_ = auVar31._8_4_ * fVar193;
  auVar165._12_4_ = auVar31._12_4_ * fVar195;
  auVar30 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar3,auVar30);
  auVar36 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar174);
  auVar31 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar182._4_4_ = uVar83;
  auVar182._0_4_ = uVar83;
  auVar182._8_4_ = uVar83;
  auVar182._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar175._0_4_ = auVar31._0_4_ * fVar200;
  auVar175._4_4_ = auVar31._4_4_ * fVar181;
  auVar175._8_4_ = auVar31._8_4_ * fVar193;
  auVar175._12_4_ = auVar31._12_4_ * fVar195;
  auVar30 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar3,auVar30);
  auVar37 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar182);
  auVar31 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar201._4_4_ = uVar83;
  auVar201._0_4_ = uVar83;
  auVar201._8_4_ = uVar83;
  auVar201._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar183._0_4_ = auVar31._0_4_ * fVar200;
  auVar183._4_4_ = auVar31._4_4_ * fVar181;
  auVar183._8_4_ = auVar31._8_4_ * fVar193;
  auVar183._12_4_ = auVar31._12_4_ * fVar195;
  auVar30 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar3,auVar30);
  auVar39 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar201);
  auVar31 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
  uVar83 = auVar31._0_4_;
  auVar202._4_4_ = uVar83;
  auVar202._0_4_ = uVar83;
  auVar202._8_4_ = uVar83;
  auVar202._12_4_ = uVar83;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar122._0_4_ = fVar200 * auVar31._0_4_;
  auVar122._4_4_ = fVar181 * auVar31._4_4_;
  auVar122._8_4_ = fVar193 * auVar31._8_4_;
  auVar122._12_4_ = fVar195 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar3,auVar30);
  auVar40 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar202);
  local_348 = vmovlhps_avx512f(auVar38,auVar36);
  auVar235 = ZEXT1664(local_348);
  local_2d8 = vmovlhps_avx(auVar34,auVar37);
  local_2e8 = vmovlhps_avx512f(auVar33,auVar39);
  _local_1e8 = vmovlhps_avx512f(auVar35,auVar40);
  auVar30 = vminps_avx512vl(local_348,local_2d8);
  auVar32 = vmaxps_avx512vl(local_348,local_2d8);
  auVar31 = vminps_avx512vl(local_2e8,_local_1e8);
  auVar31 = vminps_avx(auVar30,auVar31);
  auVar30 = vmaxps_avx512vl(local_2e8,_local_1e8);
  auVar30 = vmaxps_avx(auVar32,auVar30);
  auVar32 = vshufpd_avx(auVar31,auVar31,3);
  auVar42 = vshufpd_avx(auVar30,auVar30,3);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar30 = vmaxps_avx(auVar30,auVar42);
  auVar31 = vandps_avx512vl(auVar31,auVar233._0_16_);
  auVar30 = vandps_avx512vl(auVar30,auVar233._0_16_);
  auVar30 = vmaxps_avx(auVar31,auVar30);
  auVar31 = vmovshdup_avx(auVar30);
  auVar30 = vmaxss_avx(auVar31,auVar30);
  local_328 = local_2b0 + 0xf;
  local_168._8_8_ = auVar38._0_8_;
  local_168._0_8_ = auVar38._0_8_;
  local_178._8_8_ = auVar34._0_8_;
  local_178._0_8_ = auVar34._0_8_;
  local_188 = vmovddup_avx512vl(auVar33);
  local_198._0_8_ = auVar35._0_8_;
  local_198._8_8_ = local_198._0_8_;
  register0x00001348 = auVar36._0_8_;
  local_1a8 = auVar36._0_8_;
  register0x00001408 = auVar37._0_8_;
  local_1b8 = auVar37._0_8_;
  register0x00001448 = auVar39._0_8_;
  local_1c8 = auVar39._0_8_;
  register0x00001488 = auVar40._0_8_;
  local_1d8 = auVar40._0_8_;
  local_1f8 = ZEXT416((uint)(auVar30._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_1f8);
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar30 = vxorps_avx512vl(local_78._0_16_,auVar14);
  local_98 = vbroadcastss_avx512vl(auVar30);
  local_308 = vsubps_avx512vl(local_2d8,local_348);
  local_318 = vsubps_avx512vl(local_2e8,local_2d8);
  local_c8 = vsubps_avx512vl(_local_1e8,local_2e8);
  local_e8 = vsubps_avx(_local_218,local_208);
  local_f8 = vsubps_avx512vl(_local_268,local_248);
  local_108 = vsubps_avx512vl(_local_278,local_258);
  _local_118 = vsubps_avx512vl(_local_238,local_228);
  bVar28 = false;
  auVar30 = ZEXT816(0x3f80000000000000);
  auVar230 = ZEXT1664(auVar30);
  uVar24 = 0;
  do {
    auVar36 = auVar230._0_16_;
    auVar31 = vshufps_avx(auVar36,auVar36,0x50);
    auVar219._8_4_ = 0x3f800000;
    auVar219._0_8_ = &DAT_3f8000003f800000;
    auVar219._12_4_ = 0x3f800000;
    auVar116._16_4_ = 0x3f800000;
    auVar116._0_16_ = auVar219;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar219,auVar31);
    fVar200 = auVar31._0_4_;
    auVar110._0_4_ = local_1a8._0_4_ * fVar200;
    fVar181 = auVar31._4_4_;
    auVar110._4_4_ = local_1a8._4_4_ * fVar181;
    fVar193 = auVar31._8_4_;
    auVar110._8_4_ = local_1a8._8_4_ * fVar193;
    fVar195 = auVar31._12_4_;
    auVar110._12_4_ = local_1a8._12_4_ * fVar195;
    auVar123._0_4_ = local_1b8._0_4_ * fVar200;
    auVar123._4_4_ = local_1b8._4_4_ * fVar181;
    auVar123._8_4_ = local_1b8._8_4_ * fVar193;
    auVar123._12_4_ = local_1b8._12_4_ * fVar195;
    auVar132._0_4_ = local_1c8._0_4_ * fVar200;
    auVar132._4_4_ = local_1c8._4_4_ * fVar181;
    auVar132._8_4_ = local_1c8._8_4_ * fVar193;
    auVar132._12_4_ = local_1c8._12_4_ * fVar195;
    auVar96._0_4_ = local_1d8._0_4_ * fVar200;
    auVar96._4_4_ = local_1d8._4_4_ * fVar181;
    auVar96._8_4_ = local_1d8._8_4_ * fVar193;
    auVar96._12_4_ = local_1d8._12_4_ * fVar195;
    auVar42 = vfmadd231ps_fma(auVar110,auVar32,local_168);
    auVar38 = vfmadd231ps_fma(auVar123,auVar32,local_178);
    auVar34 = vfmadd231ps_avx512vl(auVar132,auVar32,local_188);
    auVar32 = vfmadd231ps_fma(auVar96,local_198,auVar32);
    auVar31 = vmovshdup_avx(auVar30);
    fVar181 = auVar30._0_4_;
    fVar200 = (auVar31._0_4_ - fVar181) * 0.04761905;
    auVar62._4_4_ = fVar181;
    auVar62._0_4_ = fVar181;
    auVar62._8_4_ = fVar181;
    auVar62._12_4_ = fVar181;
    auVar62._16_4_ = fVar181;
    auVar62._20_4_ = fVar181;
    auVar62._24_4_ = fVar181;
    auVar62._28_4_ = fVar181;
    auVar57._0_8_ = auVar31._0_8_;
    auVar57._8_8_ = auVar57._0_8_;
    auVar57._16_8_ = auVar57._0_8_;
    auVar57._24_8_ = auVar57._0_8_;
    auVar66 = vsubps_avx(auVar57,auVar62);
    uVar83 = auVar42._0_4_;
    auVar68._4_4_ = uVar83;
    auVar68._0_4_ = uVar83;
    auVar68._8_4_ = uVar83;
    auVar68._12_4_ = uVar83;
    auVar68._16_4_ = uVar83;
    auVar68._20_4_ = uVar83;
    auVar68._24_4_ = uVar83;
    auVar68._28_4_ = uVar83;
    auVar58._8_4_ = 1;
    auVar58._0_8_ = 0x100000001;
    auVar58._12_4_ = 1;
    auVar58._16_4_ = 1;
    auVar58._20_4_ = 1;
    auVar58._24_4_ = 1;
    auVar58._28_4_ = 1;
    auVar64 = ZEXT1632(auVar42);
    auVar63 = vpermps_avx2(auVar58,auVar64);
    auVar49 = vbroadcastss_avx512vl(auVar38);
    auVar65 = ZEXT1632(auVar38);
    auVar50 = vpermps_avx512vl(auVar58,auVar65);
    auVar51 = vbroadcastss_avx512vl(auVar34);
    auVar59 = ZEXT1632(auVar34);
    auVar52 = vpermps_avx512vl(auVar58,auVar59);
    auVar53 = vbroadcastss_avx512vl(auVar32);
    auVar61 = ZEXT1632(auVar32);
    auVar54 = vpermps_avx512vl(auVar58,auVar61);
    auVar69._4_4_ = fVar200;
    auVar69._0_4_ = fVar200;
    auVar69._8_4_ = fVar200;
    auVar69._12_4_ = fVar200;
    auVar69._16_4_ = fVar200;
    auVar69._20_4_ = fVar200;
    auVar69._24_4_ = fVar200;
    auVar69._28_4_ = fVar200;
    auVar60._8_4_ = 2;
    auVar60._0_8_ = 0x200000002;
    auVar60._12_4_ = 2;
    auVar60._16_4_ = 2;
    auVar60._20_4_ = 2;
    auVar60._24_4_ = 2;
    auVar60._28_4_ = 2;
    auVar55 = vpermps_avx512vl(auVar60,auVar64);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar57 = vpermps_avx512vl(auVar56,auVar64);
    auVar64 = vpermps_avx2(auVar60,auVar65);
    auVar58 = vpermps_avx512vl(auVar56,auVar65);
    auVar65 = vpermps_avx2(auVar60,auVar59);
    auVar59 = vpermps_avx512vl(auVar56,auVar59);
    auVar60 = vpermps_avx512vl(auVar60,auVar61);
    auVar56 = vpermps_avx512vl(auVar56,auVar61);
    auVar31 = vfmadd132ps_fma(auVar66,auVar62,_DAT_02020f20);
    auVar66 = vsubps_avx(auVar116,ZEXT1632(auVar31));
    auVar61 = vmulps_avx512vl(auVar49,ZEXT1632(auVar31));
    auVar67 = ZEXT1632(auVar31);
    auVar62 = vmulps_avx512vl(auVar50,auVar67);
    auVar32 = vfmadd231ps_fma(auVar61,auVar66,auVar68);
    auVar42 = vfmadd231ps_fma(auVar62,auVar66,auVar63);
    auVar61 = vmulps_avx512vl(auVar51,auVar67);
    auVar62 = vmulps_avx512vl(auVar52,auVar67);
    auVar49 = vfmadd231ps_avx512vl(auVar61,auVar66,auVar49);
    auVar61 = vfmadd231ps_avx512vl(auVar62,auVar66,auVar50);
    auVar50 = vmulps_avx512vl(auVar53,auVar67);
    auVar68 = ZEXT1632(auVar31);
    auVar54 = vmulps_avx512vl(auVar54,auVar68);
    auVar62 = vfmadd231ps_avx512vl(auVar50,auVar66,auVar51);
    auVar54 = vfmadd231ps_avx512vl(auVar54,auVar66,auVar52);
    fVar193 = auVar31._0_4_;
    fVar195 = auVar31._4_4_;
    auVar50._4_4_ = fVar195 * auVar49._4_4_;
    auVar50._0_4_ = fVar193 * auVar49._0_4_;
    fVar197 = auVar31._8_4_;
    auVar50._8_4_ = fVar197 * auVar49._8_4_;
    fVar198 = auVar31._12_4_;
    auVar50._12_4_ = fVar198 * auVar49._12_4_;
    auVar50._16_4_ = auVar49._16_4_ * 0.0;
    auVar50._20_4_ = auVar49._20_4_ * 0.0;
    auVar50._24_4_ = auVar49._24_4_ * 0.0;
    auVar50._28_4_ = fVar181;
    auVar51._4_4_ = fVar195 * auVar61._4_4_;
    auVar51._0_4_ = fVar193 * auVar61._0_4_;
    auVar51._8_4_ = fVar197 * auVar61._8_4_;
    auVar51._12_4_ = fVar198 * auVar61._12_4_;
    auVar51._16_4_ = auVar61._16_4_ * 0.0;
    auVar51._20_4_ = auVar61._20_4_ * 0.0;
    auVar51._24_4_ = auVar61._24_4_ * 0.0;
    auVar51._28_4_ = auVar63._28_4_;
    auVar32 = vfmadd231ps_fma(auVar50,auVar66,ZEXT1632(auVar32));
    auVar42 = vfmadd231ps_fma(auVar51,auVar66,ZEXT1632(auVar42));
    auVar67._0_4_ = fVar193 * auVar62._0_4_;
    auVar67._4_4_ = fVar195 * auVar62._4_4_;
    auVar67._8_4_ = fVar197 * auVar62._8_4_;
    auVar67._12_4_ = fVar198 * auVar62._12_4_;
    auVar67._16_4_ = auVar62._16_4_ * 0.0;
    auVar67._20_4_ = auVar62._20_4_ * 0.0;
    auVar67._24_4_ = auVar62._24_4_ * 0.0;
    auVar67._28_4_ = 0;
    auVar52._4_4_ = fVar195 * auVar54._4_4_;
    auVar52._0_4_ = fVar193 * auVar54._0_4_;
    auVar52._8_4_ = fVar197 * auVar54._8_4_;
    auVar52._12_4_ = fVar198 * auVar54._12_4_;
    auVar52._16_4_ = auVar54._16_4_ * 0.0;
    auVar52._20_4_ = auVar54._20_4_ * 0.0;
    auVar52._24_4_ = auVar54._24_4_ * 0.0;
    auVar52._28_4_ = auVar62._28_4_;
    auVar38 = vfmadd231ps_fma(auVar67,auVar66,auVar49);
    auVar34 = vfmadd231ps_fma(auVar52,auVar66,auVar61);
    auVar54._28_4_ = auVar61._28_4_;
    auVar54._0_28_ =
         ZEXT1628(CONCAT412(fVar198 * auVar34._12_4_,
                            CONCAT48(fVar197 * auVar34._8_4_,
                                     CONCAT44(fVar195 * auVar34._4_4_,fVar193 * auVar34._0_4_))));
    auVar33 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar198 * auVar38._12_4_,
                                                 CONCAT48(fVar197 * auVar38._8_4_,
                                                          CONCAT44(fVar195 * auVar38._4_4_,
                                                                   fVar193 * auVar38._0_4_)))),
                              auVar66,ZEXT1632(auVar32));
    auVar35 = vfmadd231ps_fma(auVar54,auVar66,ZEXT1632(auVar42));
    auVar63 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar32));
    auVar49 = vsubps_avx(ZEXT1632(auVar34),ZEXT1632(auVar42));
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar63 = vmulps_avx512vl(auVar63,auVar50);
    auVar49 = vmulps_avx512vl(auVar49,auVar50);
    auVar61._0_4_ = fVar200 * auVar63._0_4_;
    auVar61._4_4_ = fVar200 * auVar63._4_4_;
    auVar61._8_4_ = fVar200 * auVar63._8_4_;
    auVar61._12_4_ = fVar200 * auVar63._12_4_;
    auVar61._16_4_ = fVar200 * auVar63._16_4_;
    auVar61._20_4_ = fVar200 * auVar63._20_4_;
    auVar61._24_4_ = fVar200 * auVar63._24_4_;
    auVar61._28_4_ = 0;
    auVar63 = vmulps_avx512vl(auVar69,auVar49);
    auVar38 = vxorps_avx512vl(auVar53._0_16_,auVar53._0_16_);
    auVar49 = vpermt2ps_avx512vl(ZEXT1632(auVar33),_DAT_0205fd20,ZEXT1632(auVar38));
    auVar51 = vpermt2ps_avx512vl(ZEXT1632(auVar35),_DAT_0205fd20,ZEXT1632(auVar38));
    auVar102._0_4_ = auVar61._0_4_ + auVar33._0_4_;
    auVar102._4_4_ = auVar61._4_4_ + auVar33._4_4_;
    auVar102._8_4_ = auVar61._8_4_ + auVar33._8_4_;
    auVar102._12_4_ = auVar61._12_4_ + auVar33._12_4_;
    auVar102._16_4_ = auVar61._16_4_ + 0.0;
    auVar102._20_4_ = auVar61._20_4_ + 0.0;
    auVar102._24_4_ = auVar61._24_4_ + 0.0;
    auVar102._28_4_ = 0;
    auVar62 = ZEXT1632(auVar38);
    auVar52 = vpermt2ps_avx512vl(auVar61,_DAT_0205fd20,auVar62);
    auVar54 = vaddps_avx512vl(ZEXT1632(auVar35),auVar63);
    auVar53 = vpermt2ps_avx512vl(auVar63,_DAT_0205fd20,auVar62);
    auVar63 = vsubps_avx(auVar49,auVar52);
    auVar52 = vsubps_avx512vl(auVar51,auVar53);
    auVar53 = vmulps_avx512vl(auVar64,auVar68);
    auVar61 = vmulps_avx512vl(auVar58,auVar68);
    auVar53 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar55);
    auVar55 = vfmadd231ps_avx512vl(auVar61,auVar66,auVar57);
    auVar57 = vmulps_avx512vl(auVar65,auVar68);
    auVar61 = vmulps_avx512vl(auVar59,auVar68);
    auVar64 = vfmadd231ps_avx512vl(auVar57,auVar66,auVar64);
    auVar57 = vfmadd231ps_avx512vl(auVar61,auVar66,auVar58);
    auVar58 = vmulps_avx512vl(auVar60,auVar68);
    auVar56 = vmulps_avx512vl(auVar56,auVar68);
    auVar32 = vfmadd231ps_fma(auVar58,auVar66,auVar65);
    auVar42 = vfmadd231ps_fma(auVar56,auVar66,auVar59);
    auVar56 = vmulps_avx512vl(auVar68,auVar64);
    auVar58 = vmulps_avx512vl(ZEXT1632(auVar31),auVar57);
    auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar53);
    auVar58 = vfmadd231ps_avx512vl(auVar58,auVar66,auVar55);
    auVar64 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar198 * auVar32._12_4_,
                                            CONCAT48(fVar197 * auVar32._8_4_,
                                                     CONCAT44(fVar195 * auVar32._4_4_,
                                                              fVar193 * auVar32._0_4_)))),auVar66,
                         auVar64);
    auVar57 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar198 * auVar42._12_4_,
                                            CONCAT48(fVar197 * auVar42._8_4_,
                                                     CONCAT44(fVar195 * auVar42._4_4_,
                                                              fVar193 * auVar42._0_4_)))),auVar66,
                         auVar57);
    auVar53._4_4_ = fVar195 * auVar64._4_4_;
    auVar53._0_4_ = fVar193 * auVar64._0_4_;
    auVar53._8_4_ = fVar197 * auVar64._8_4_;
    auVar53._12_4_ = fVar198 * auVar64._12_4_;
    auVar53._16_4_ = auVar64._16_4_ * 0.0;
    auVar53._20_4_ = auVar64._20_4_ * 0.0;
    auVar53._24_4_ = auVar64._24_4_ * 0.0;
    auVar53._28_4_ = auVar59._28_4_;
    auVar55._4_4_ = fVar195 * auVar57._4_4_;
    auVar55._0_4_ = fVar193 * auVar57._0_4_;
    auVar55._8_4_ = fVar197 * auVar57._8_4_;
    auVar55._12_4_ = fVar198 * auVar57._12_4_;
    auVar55._16_4_ = auVar57._16_4_ * 0.0;
    auVar55._20_4_ = auVar57._20_4_ * 0.0;
    auVar55._24_4_ = auVar57._24_4_ * 0.0;
    auVar55._28_4_ = auVar65._28_4_;
    auVar65 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar56);
    auVar53 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar66);
    auVar66 = vsubps_avx512vl(auVar64,auVar56);
    auVar64 = vsubps_avx512vl(auVar57,auVar58);
    auVar66 = vmulps_avx512vl(auVar66,auVar50);
    auVar64 = vmulps_avx512vl(auVar64,auVar50);
    fVar181 = fVar200 * auVar66._0_4_;
    fVar193 = fVar200 * auVar66._4_4_;
    auVar56._4_4_ = fVar193;
    auVar56._0_4_ = fVar181;
    fVar195 = fVar200 * auVar66._8_4_;
    auVar56._8_4_ = fVar195;
    fVar197 = fVar200 * auVar66._12_4_;
    auVar56._12_4_ = fVar197;
    fVar198 = fVar200 * auVar66._16_4_;
    auVar56._16_4_ = fVar198;
    fVar199 = fVar200 * auVar66._20_4_;
    auVar56._20_4_ = fVar199;
    fVar200 = fVar200 * auVar66._24_4_;
    auVar56._24_4_ = fVar200;
    auVar56._28_4_ = auVar66._28_4_;
    auVar64 = vmulps_avx512vl(auVar69,auVar64);
    auVar50 = vpermt2ps_avx512vl(auVar65,_DAT_0205fd20,auVar62);
    auVar55 = vpermt2ps_avx512vl(auVar53,_DAT_0205fd20,auVar62);
    auVar179._0_4_ = auVar65._0_4_ + fVar181;
    auVar179._4_4_ = auVar65._4_4_ + fVar193;
    auVar179._8_4_ = auVar65._8_4_ + fVar195;
    auVar179._12_4_ = auVar65._12_4_ + fVar197;
    auVar179._16_4_ = auVar65._16_4_ + fVar198;
    auVar179._20_4_ = auVar65._20_4_ + fVar199;
    auVar179._24_4_ = auVar65._24_4_ + fVar200;
    auVar179._28_4_ = auVar65._28_4_ + auVar66._28_4_;
    auVar66 = vpermt2ps_avx512vl(auVar56,_DAT_0205fd20,ZEXT1632(auVar38));
    auVar56 = vaddps_avx512vl(auVar53,auVar64);
    auVar64 = vpermt2ps_avx512vl(auVar64,_DAT_0205fd20,ZEXT1632(auVar38));
    auVar66 = vsubps_avx(auVar50,auVar66);
    auVar64 = vsubps_avx512vl(auVar55,auVar64);
    auVar116 = ZEXT1632(auVar33);
    auVar57 = vsubps_avx512vl(auVar65,auVar116);
    auVar117 = ZEXT1632(auVar35);
    auVar58 = vsubps_avx512vl(auVar53,auVar117);
    auVar59 = vsubps_avx512vl(auVar50,auVar49);
    auVar57 = vaddps_avx512vl(auVar57,auVar59);
    auVar59 = vsubps_avx512vl(auVar55,auVar51);
    auVar58 = vaddps_avx512vl(auVar58,auVar59);
    auVar59 = vmulps_avx512vl(auVar117,auVar57);
    auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar116,auVar58);
    auVar60 = vmulps_avx512vl(auVar54,auVar57);
    auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar102,auVar58);
    auVar61 = vmulps_avx512vl(auVar52,auVar57);
    auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar63,auVar58);
    auVar62 = vmulps_avx512vl(auVar51,auVar57);
    auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar49,auVar58);
    auVar67 = vmulps_avx512vl(auVar53,auVar57);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar65,auVar58);
    auVar68 = vmulps_avx512vl(auVar56,auVar57);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar179,auVar58);
    auVar69 = vmulps_avx512vl(auVar64,auVar57);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar66,auVar58);
    auVar57 = vmulps_avx512vl(auVar55,auVar57);
    auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar50,auVar58);
    auVar58 = vminps_avx512vl(auVar59,auVar60);
    auVar59 = vmaxps_avx512vl(auVar59,auVar60);
    auVar60 = vminps_avx512vl(auVar61,auVar62);
    auVar58 = vminps_avx512vl(auVar58,auVar60);
    auVar60 = vmaxps_avx512vl(auVar61,auVar62);
    auVar59 = vmaxps_avx512vl(auVar59,auVar60);
    auVar60 = vminps_avx512vl(auVar67,auVar68);
    auVar61 = vmaxps_avx512vl(auVar67,auVar68);
    auVar62 = vminps_avx512vl(auVar69,auVar57);
    auVar60 = vminps_avx512vl(auVar60,auVar62);
    auVar58 = vminps_avx512vl(auVar58,auVar60);
    auVar57 = vmaxps_avx512vl(auVar69,auVar57);
    auVar57 = vmaxps_avx512vl(auVar61,auVar57);
    auVar57 = vmaxps_avx512vl(auVar59,auVar57);
    uVar11 = vcmpps_avx512vl(auVar58,local_78,2);
    uVar12 = vcmpps_avx512vl(auVar57,local_98,5);
    uVar26 = 0;
    bVar19 = (byte)uVar11 & (byte)uVar12 & 0x7f;
    if (bVar19 != 0) {
      auVar57 = vsubps_avx512vl(auVar49,auVar116);
      auVar58 = vsubps_avx512vl(auVar51,auVar117);
      auVar59 = vsubps_avx512vl(auVar50,auVar65);
      auVar57 = vaddps_avx512vl(auVar57,auVar59);
      auVar59 = vsubps_avx512vl(auVar55,auVar53);
      auVar58 = vaddps_avx512vl(auVar58,auVar59);
      auVar59 = vmulps_avx512vl(auVar117,auVar57);
      auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar58,auVar116);
      auVar54 = vmulps_avx512vl(auVar54,auVar57);
      auVar54 = vfnmadd213ps_avx512vl(auVar102,auVar58,auVar54);
      auVar52 = vmulps_avx512vl(auVar52,auVar57);
      auVar52 = vfnmadd213ps_avx512vl(auVar63,auVar58,auVar52);
      auVar63 = vmulps_avx512vl(auVar51,auVar57);
      auVar51 = vfnmadd231ps_avx512vl(auVar63,auVar58,auVar49);
      auVar63 = vmulps_avx512vl(auVar53,auVar57);
      auVar53 = vfnmadd231ps_avx512vl(auVar63,auVar58,auVar65);
      auVar63 = vmulps_avx512vl(auVar56,auVar57);
      auVar56 = vfnmadd213ps_avx512vl(auVar179,auVar58,auVar63);
      auVar63 = vmulps_avx512vl(auVar64,auVar57);
      auVar60 = vfnmadd213ps_avx512vl(auVar66,auVar58,auVar63);
      auVar66 = vmulps_avx512vl(auVar55,auVar57);
      auVar55 = vfnmadd231ps_avx512vl(auVar66,auVar50,auVar58);
      auVar63 = vminps_avx(auVar59,auVar54);
      auVar66 = vmaxps_avx(auVar59,auVar54);
      auVar49 = vminps_avx(auVar52,auVar51);
      auVar49 = vminps_avx(auVar63,auVar49);
      auVar63 = vmaxps_avx(auVar52,auVar51);
      auVar66 = vmaxps_avx(auVar66,auVar63);
      auVar65 = vminps_avx(auVar53,auVar56);
      auVar63 = vmaxps_avx(auVar53,auVar56);
      auVar50 = vminps_avx(auVar60,auVar55);
      auVar65 = vminps_avx(auVar65,auVar50);
      auVar65 = vminps_avx(auVar49,auVar65);
      auVar49 = vmaxps_avx(auVar60,auVar55);
      auVar63 = vmaxps_avx(auVar63,auVar49);
      auVar66 = vmaxps_avx(auVar66,auVar63);
      uVar11 = vcmpps_avx512vl(auVar66,local_98,5);
      uVar12 = vcmpps_avx512vl(auVar65,local_78,2);
      uVar26 = (uint)(bVar19 & (byte)uVar11 & (byte)uVar12);
    }
    if (uVar26 != 0) {
      auStack_158[uVar24] = uVar26;
      uVar11 = vmovlps_avx(auVar30);
      *(undefined8 *)(&uStack_b8 + uVar24 * 2) = uVar11;
      uVar21 = vmovlps_avx(auVar36);
      auStack_58[uVar24] = uVar21;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar231 = ZEXT3264(auVar66);
    auVar232 = ZEXT464(0x3f800000);
    auVar30 = vxorps_avx512vl(auVar64._0_16_,auVar64._0_16_);
    in_ZMM16 = ZEXT1664(auVar30);
    auVar236 = ZEXT1664(local_308);
    auVar238 = ZEXT1664(local_318);
    do {
      auVar31 = auVar234._0_16_;
      auVar32 = auVar237._0_16_;
      auVar30 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar24 == 0) {
        if (bVar28) {
          return bVar29;
        }
        fVar200 = ray->tfar;
        auVar18._4_4_ = fVar200;
        auVar18._0_4_ = fVar200;
        auVar18._8_4_ = fVar200;
        auVar18._12_4_ = fVar200;
        uVar11 = vcmpps_avx512vl(local_d8,auVar18,2);
        uVar27 = (uint)local_2b0 & (uint)local_328 & (uint)uVar11;
        local_2b0 = (ulong)uVar27;
        bVar29 = uVar27 != 0;
        if (!bVar29) {
          return bVar29;
        }
        goto LAB_01b38de7;
      }
      uVar20 = (int)uVar24 - 1;
      uVar22 = (ulong)uVar20;
      uVar26 = (&uStack_b8)[uVar22 * 2];
      fVar200 = afStack_b4[uVar22 * 2];
      uVar5 = auStack_158[uVar22];
      auVar224._8_8_ = 0;
      auVar224._0_8_ = auStack_58[uVar22];
      auVar230 = ZEXT1664(auVar224);
      lVar25 = 0;
      for (uVar21 = (ulong)uVar5; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar23 = uVar5 - 1 & uVar5;
      auStack_158[uVar22] = uVar23;
      if (uVar23 == 0) {
        uVar24 = (ulong)uVar20;
      }
      auVar42 = vcvtsi2ss_avx512f(auVar32,lVar25);
      auVar38 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0x3e124925),0));
      lVar25 = lVar25 + 1;
      auVar42 = vcvtsi2ss_avx512f(auVar32,lVar25);
      auVar42 = vmulss_avx512f(auVar42,SUB6416(ZEXT464(0x3e124925),0));
      auVar33 = auVar232._0_16_;
      auVar34 = vsubss_avx512f(auVar33,auVar38);
      local_338 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar38._0_4_)),ZEXT416(uVar26),auVar34);
      auVar38 = vsubss_avx512f(auVar33,auVar42);
      auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar42._0_4_)),ZEXT416(uVar26),auVar38);
      fVar181 = auVar42._0_4_;
      fVar193 = local_338._0_4_;
      fVar200 = fVar181 - fVar193;
      vucomiss_avx512f(ZEXT416((uint)fVar200));
      if (uVar5 == 0 || lVar25 == 0) break;
      auVar38 = vshufps_avx(auVar224,auVar224,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar200));
      uVar26 = (uint)uVar24;
      auVar36 = vsubps_avx512vl(auVar31,auVar38);
      fVar195 = auVar38._0_4_;
      auVar111._0_4_ = fVar195 * (float)local_1a8._0_4_;
      fVar197 = auVar38._4_4_;
      auVar111._4_4_ = fVar197 * (float)local_1a8._4_4_;
      fVar198 = auVar38._8_4_;
      auVar111._8_4_ = fVar198 * fStack_1a0;
      fVar199 = auVar38._12_4_;
      auVar111._12_4_ = fVar199 * fStack_19c;
      auVar124._0_4_ = fVar195 * (float)local_1b8._0_4_;
      auVar124._4_4_ = fVar197 * (float)local_1b8._4_4_;
      auVar124._8_4_ = fVar198 * fStack_1b0;
      auVar124._12_4_ = fVar199 * fStack_1ac;
      auVar133._0_4_ = fVar195 * (float)local_1c8._0_4_;
      auVar133._4_4_ = fVar197 * (float)local_1c8._4_4_;
      auVar133._8_4_ = fVar198 * fStack_1c0;
      auVar133._12_4_ = fVar199 * fStack_1bc;
      auVar97._0_4_ = fVar195 * (float)local_1d8._0_4_;
      auVar97._4_4_ = fVar197 * (float)local_1d8._4_4_;
      auVar97._8_4_ = fVar198 * fStack_1d0;
      auVar97._12_4_ = fVar199 * fStack_1cc;
      auVar38 = vfmadd231ps_fma(auVar111,auVar36,local_168);
      auVar34 = vfmadd231ps_fma(auVar124,auVar36,local_178);
      auVar35 = vfmadd231ps_fma(auVar133,auVar36,local_188);
      auVar36 = vfmadd231ps_fma(auVar97,auVar36,local_198);
      auVar59._16_16_ = auVar38;
      auVar59._0_16_ = auVar38;
      auVar117._16_16_ = auVar34;
      auVar117._0_16_ = auVar34;
      auVar127._16_16_ = auVar35;
      auVar127._0_16_ = auVar35;
      auVar147._4_4_ = fVar193;
      auVar147._0_4_ = fVar193;
      auVar147._8_4_ = fVar193;
      auVar147._12_4_ = fVar193;
      auVar147._20_4_ = fVar181;
      auVar147._16_4_ = fVar181;
      auVar147._24_4_ = fVar181;
      auVar147._28_4_ = fVar181;
      auVar66 = vsubps_avx(auVar117,auVar59);
      auVar34 = vfmadd213ps_fma(auVar66,auVar147,auVar59);
      auVar66 = vsubps_avx(auVar127,auVar117);
      auVar37 = vfmadd213ps_fma(auVar66,auVar147,auVar117);
      auVar38 = vsubps_avx(auVar36,auVar35);
      auVar118._16_16_ = auVar38;
      auVar118._0_16_ = auVar38;
      auVar38 = vfmadd213ps_fma(auVar118,auVar147,auVar127);
      auVar66 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar34));
      auVar34 = vfmadd213ps_fma(auVar66,auVar147,ZEXT1632(auVar34));
      auVar66 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar37));
      auVar38 = vfmadd213ps_fma(auVar66,auVar147,ZEXT1632(auVar37));
      auVar66 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar34));
      auVar46 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar66,auVar147);
      auVar66 = vmulps_avx512vl(auVar66,auVar231._0_32_);
      auVar38 = vmulss_avx512f(ZEXT416((uint)fVar200),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar181 = auVar38._0_4_;
      auVar134._0_8_ =
           CONCAT44(auVar46._4_4_ + fVar181 * auVar66._4_4_,auVar46._0_4_ + fVar181 * auVar66._0_4_)
      ;
      auVar134._8_4_ = auVar46._8_4_ + fVar181 * auVar66._8_4_;
      auVar134._12_4_ = auVar46._12_4_ + fVar181 * auVar66._12_4_;
      auVar112._0_4_ = fVar181 * auVar66._16_4_;
      auVar112._4_4_ = fVar181 * auVar66._20_4_;
      auVar112._8_4_ = fVar181 * auVar66._24_4_;
      auVar112._12_4_ = fVar181 * auVar66._28_4_;
      auVar90 = vsubps_avx((undefined1  [16])0x0,auVar112);
      auVar40 = vshufpd_avx(auVar46,auVar46,3);
      auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar38 = vsubps_avx(auVar40,auVar46);
      auVar34 = vsubps_avx(auVar41,(undefined1  [16])0x0);
      auVar152._0_4_ = auVar34._0_4_ + auVar38._0_4_;
      auVar152._4_4_ = auVar34._4_4_ + auVar38._4_4_;
      auVar152._8_4_ = auVar34._8_4_ + auVar38._8_4_;
      auVar152._12_4_ = auVar34._12_4_ + auVar38._12_4_;
      auVar38 = vshufps_avx(auVar46,auVar46,0xb1);
      auVar34 = vshufps_avx(auVar134,auVar134,0xb1);
      auVar35 = vshufps_avx(auVar90,auVar90,0xb1);
      auVar36 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar211._4_4_ = auVar152._0_4_;
      auVar211._0_4_ = auVar152._0_4_;
      auVar211._8_4_ = auVar152._0_4_;
      auVar211._12_4_ = auVar152._0_4_;
      auVar37 = vshufps_avx(auVar152,auVar152,0x55);
      fVar181 = auVar37._0_4_;
      auVar166._0_4_ = auVar38._0_4_ * fVar181;
      fVar193 = auVar37._4_4_;
      auVar166._4_4_ = auVar38._4_4_ * fVar193;
      fVar195 = auVar37._8_4_;
      auVar166._8_4_ = auVar38._8_4_ * fVar195;
      fVar197 = auVar37._12_4_;
      auVar166._12_4_ = auVar38._12_4_ * fVar197;
      auVar176._0_4_ = auVar34._0_4_ * fVar181;
      auVar176._4_4_ = auVar34._4_4_ * fVar193;
      auVar176._8_4_ = auVar34._8_4_ * fVar195;
      auVar176._12_4_ = auVar34._12_4_ * fVar197;
      auVar184._0_4_ = auVar35._0_4_ * fVar181;
      auVar184._4_4_ = auVar35._4_4_ * fVar193;
      auVar184._8_4_ = auVar35._8_4_ * fVar195;
      auVar184._12_4_ = auVar35._12_4_ * fVar197;
      auVar153._0_4_ = auVar36._0_4_ * fVar181;
      auVar153._4_4_ = auVar36._4_4_ * fVar193;
      auVar153._8_4_ = auVar36._8_4_ * fVar195;
      auVar153._12_4_ = auVar36._12_4_ * fVar197;
      auVar38 = vfmadd231ps_fma(auVar166,auVar211,auVar46);
      auVar34 = vfmadd231ps_fma(auVar176,auVar211,auVar134);
      auVar37 = vfmadd231ps_fma(auVar184,auVar211,auVar90);
      auVar45 = vfmadd231ps_fma(auVar153,(undefined1  [16])0x0,auVar211);
      auVar39 = vshufpd_avx(auVar38,auVar38,1);
      auVar43 = vshufpd_avx(auVar34,auVar34,1);
      auVar44 = vshufpd_avx(auVar37,auVar37,1);
      auVar48 = vshufpd_avx(auVar45,auVar45,1);
      auVar35 = vminss_avx(auVar38,auVar34);
      auVar38 = vmaxss_avx(auVar34,auVar38);
      auVar36 = vminss_avx(auVar37,auVar45);
      auVar34 = vmaxss_avx(auVar45,auVar37);
      auVar36 = vminss_avx(auVar35,auVar36);
      auVar38 = vmaxss_avx(auVar34,auVar38);
      auVar37 = vminss_avx(auVar39,auVar43);
      auVar34 = vmaxss_avx(auVar43,auVar39);
      auVar39 = vminss_avx(auVar44,auVar48);
      auVar35 = vmaxss_avx(auVar48,auVar44);
      auVar37 = vminss_avx(auVar37,auVar39);
      auVar34 = vmaxss_avx(auVar35,auVar34);
      vucomiss_avx512f(auVar36);
      if ((uVar26 < 5) || (auVar34 = vucomiss_avx512f(auVar30), uVar26 < 5)) {
        auVar38 = vucomiss_avx512f(auVar30);
        uVar11 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar12 = vcmpps_avx512vl(auVar36,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar26 & ((byte)uVar12 | (byte)uVar11)) != 0) goto LAB_01b39c1a;
        uVar11 = vcmpps_avx512vl(auVar30,auVar34,5);
        uVar12 = vcmpps_avx512vl(auVar37,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar12 | (ushort)uVar11) & 1) == 0) goto LAB_01b39c1a;
LAB_01b3a89a:
        bVar13 = true;
        auVar230 = ZEXT1664(auVar224);
      }
      else {
LAB_01b39c1a:
        uVar11 = vcmpss_avx512f(auVar36,in_ZMM16._0_16_,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        iVar81 = auVar232._0_4_;
        fVar181 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar81);
        uVar11 = vcmpss_avx512f(auVar38,ZEXT816(0) << 0x20,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        fVar193 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar81);
        auVar66._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar70._4_28_ = auVar66._4_28_;
        auVar70._0_4_ = (uint)(fVar181 == fVar193) * 0x7f800000;
        auVar35 = auVar70._0_16_;
        auVar72._16_16_ = auVar66._16_16_;
        auVar72._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar71._4_28_ = auVar72._4_28_;
        auVar71._0_4_ = (uint)(fVar181 == fVar193) * -0x800000;
        auVar30 = auVar71._0_16_;
        uVar11 = vcmpss_avx512f(auVar37,ZEXT816(0) << 0x20,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        fVar195 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar81);
        auVar39 = ZEXT416(0xbf800000);
        if ((fVar181 != fVar195) || (NAN(fVar181) || NAN(fVar195))) {
          fVar197 = auVar37._0_4_;
          fVar181 = auVar36._0_4_;
          bVar13 = fVar197 == fVar181;
          if ((!bVar13) || (NAN(fVar197) || NAN(fVar181))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar36 = vxorps_avx512vl(auVar36,auVar17);
            auVar225._0_4_ = auVar36._0_4_ / (fVar197 - fVar181);
            auVar225._4_12_ = auVar36._4_12_;
            auVar36 = vsubss_avx512f(auVar33,auVar225);
            auVar39 = vxorps_avx512vl(auVar39,auVar39);
            auVar37 = vfmadd213ss_avx512f(auVar36,auVar39,auVar225);
            auVar36 = auVar37;
          }
          else {
            auVar39 = vxorps_avx512vl(auVar39,auVar39);
            vucomiss_avx512f(auVar39);
            auVar74._16_16_ = auVar66._16_16_;
            auVar74._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar73._4_28_ = auVar74._4_28_;
            auVar73._0_4_ = (uint)bVar13 * auVar39._0_4_ + (uint)!bVar13 * 0x7f800000;
            auVar37 = auVar73._0_16_;
            auVar36 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar35 = vminss_avx(auVar35,auVar37);
          auVar30 = vmaxss_avx(auVar36,auVar30);
        }
        else {
          auVar39 = vxorps_avx512vl(auVar39,auVar39);
        }
        in_ZMM16 = ZEXT1664(auVar39);
        uVar11 = vcmpss_avx512f(auVar34,auVar39,1);
        bVar13 = (bool)((byte)uVar11 & 1);
        fVar181 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar81);
        if ((fVar193 != fVar181) || (NAN(fVar193) || NAN(fVar181))) {
          fVar197 = auVar34._0_4_;
          fVar193 = auVar38._0_4_;
          bVar13 = fVar197 == fVar193;
          if ((!bVar13) || (NAN(fVar197) || NAN(fVar193))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar38 = vxorps_avx512vl(auVar38,auVar16);
            auVar185._0_4_ = auVar38._0_4_ / (fVar197 - fVar193);
            auVar185._4_12_ = auVar38._4_12_;
            auVar38 = vsubss_avx512f(auVar33,auVar185);
            auVar34 = vfmadd213ss_avx512f(auVar38,auVar39,auVar185);
            auVar38 = auVar34;
          }
          else {
            vucomiss_avx512f(auVar39);
            auVar76._16_16_ = auVar66._16_16_;
            auVar76._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar75._4_28_ = auVar76._4_28_;
            auVar75._0_4_ = (uint)bVar13 * auVar39._0_4_ + (uint)!bVar13 * 0x7f800000;
            auVar34 = auVar75._0_16_;
            auVar38 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar35 = vminss_avx(auVar35,auVar34);
          auVar30 = vmaxss_avx(auVar38,auVar30);
        }
        bVar13 = fVar195 != fVar181;
        auVar38 = vminss_avx512f(auVar35,auVar33);
        auVar78._16_16_ = auVar66._16_16_;
        auVar78._0_16_ = auVar35;
        auVar77._4_28_ = auVar78._4_28_;
        auVar77._0_4_ = (uint)bVar13 * auVar38._0_4_ + (uint)!bVar13 * auVar35._0_4_;
        auVar38 = vmaxss_avx512f(auVar33,auVar30);
        auVar80._16_16_ = auVar66._16_16_;
        auVar80._0_16_ = auVar30;
        auVar79._4_28_ = auVar80._4_28_;
        auVar79._0_4_ = (uint)bVar13 * auVar38._0_4_ + (uint)!bVar13 * auVar30._0_4_;
        auVar30 = vmaxss_avx512f(auVar39,auVar77._0_16_);
        auVar38 = vminss_avx512f(auVar79._0_16_,auVar33);
        bVar13 = true;
        if (auVar38._0_4_ < auVar30._0_4_) goto LAB_01b3a89a;
        auVar35 = vmaxss_avx512f(auVar39,ZEXT416((uint)(auVar30._0_4_ + -0.1)));
        auVar43 = vminss_avx512f(ZEXT416((uint)(auVar38._0_4_ + 0.1)),auVar33);
        auVar98._0_8_ = auVar46._0_8_;
        auVar98._8_8_ = auVar98._0_8_;
        auVar177._8_8_ = auVar134._0_8_;
        auVar177._0_8_ = auVar134._0_8_;
        auVar186._8_8_ = auVar90._0_8_;
        auVar186._0_8_ = auVar90._0_8_;
        auVar30 = vshufpd_avx(auVar134,auVar134,3);
        auVar38 = vshufpd_avx(auVar90,auVar90,3);
        auVar34 = vshufps_avx(auVar35,auVar43,0);
        auVar44 = vsubps_avx512vl(auVar31,auVar34);
        fVar181 = auVar34._0_4_;
        auVar220._0_4_ = fVar181 * auVar40._0_4_;
        fVar193 = auVar34._4_4_;
        auVar220._4_4_ = fVar193 * auVar40._4_4_;
        fVar195 = auVar34._8_4_;
        auVar220._8_4_ = fVar195 * auVar40._8_4_;
        fVar197 = auVar34._12_4_;
        auVar220._12_4_ = fVar197 * auVar40._12_4_;
        auVar135._0_4_ = fVar181 * auVar30._0_4_;
        auVar135._4_4_ = fVar193 * auVar30._4_4_;
        auVar135._8_4_ = fVar195 * auVar30._8_4_;
        auVar135._12_4_ = fVar197 * auVar30._12_4_;
        auVar144._0_4_ = fVar181 * auVar38._0_4_;
        auVar144._4_4_ = fVar193 * auVar38._4_4_;
        auVar144._8_4_ = fVar195 * auVar38._8_4_;
        auVar144._12_4_ = fVar197 * auVar38._12_4_;
        auVar113._0_4_ = fVar181 * auVar41._0_4_;
        auVar113._4_4_ = fVar193 * auVar41._4_4_;
        auVar113._8_4_ = fVar195 * auVar41._8_4_;
        auVar113._12_4_ = fVar197 * auVar41._12_4_;
        auVar36 = vfmadd231ps_fma(auVar220,auVar44,auVar98);
        auVar37 = vfmadd231ps_fma(auVar135,auVar44,auVar177);
        auVar39 = vfmadd231ps_fma(auVar144,auVar44,auVar186);
        auVar40 = vfmadd231ps_fma(auVar113,auVar44,ZEXT816(0));
        auVar30 = vsubss_avx512f(auVar33,auVar35);
        auVar38 = vmovshdup_avx512vl(auVar224);
        auVar45 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar35._0_4_)),auVar224,
                                      auVar30);
        auVar30 = vsubss_avx512f(auVar33,auVar43);
        auVar46 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar43._0_4_ * auVar38._0_4_)),auVar224,
                                      auVar30);
        auVar41 = vdivss_avx512f(auVar33,ZEXT416((uint)fVar200));
        auVar30 = vsubps_avx(auVar37,auVar36);
        auVar34 = vmulps_avx512vl(auVar30,auVar32);
        auVar30 = vsubps_avx(auVar39,auVar37);
        auVar35 = vmulps_avx512vl(auVar30,auVar32);
        auVar30 = vsubps_avx(auVar40,auVar39);
        auVar30 = vmulps_avx512vl(auVar30,auVar32);
        auVar38 = vminps_avx(auVar35,auVar30);
        auVar30 = vmaxps_avx(auVar35,auVar30);
        auVar38 = vminps_avx(auVar34,auVar38);
        auVar30 = vmaxps_avx(auVar34,auVar30);
        auVar34 = vshufpd_avx(auVar38,auVar38,3);
        auVar35 = vshufpd_avx(auVar30,auVar30,3);
        auVar38 = vminps_avx(auVar38,auVar34);
        auVar30 = vmaxps_avx(auVar30,auVar35);
        fVar200 = auVar41._0_4_;
        auVar167._0_4_ = fVar200 * auVar38._0_4_;
        auVar167._4_4_ = fVar200 * auVar38._4_4_;
        auVar167._8_4_ = fVar200 * auVar38._8_4_;
        auVar167._12_4_ = fVar200 * auVar38._12_4_;
        auVar154._0_4_ = fVar200 * auVar30._0_4_;
        auVar154._4_4_ = fVar200 * auVar30._4_4_;
        auVar154._8_4_ = fVar200 * auVar30._8_4_;
        auVar154._12_4_ = fVar200 * auVar30._12_4_;
        auVar41 = vdivss_avx512f(auVar33,ZEXT416((uint)(auVar46._0_4_ - auVar45._0_4_)));
        auVar30 = vshufpd_avx(auVar36,auVar36,3);
        auVar38 = vshufpd_avx(auVar37,auVar37,3);
        auVar34 = vshufpd_avx(auVar39,auVar39,3);
        auVar35 = vshufpd_avx(auVar40,auVar40,3);
        auVar30 = vsubps_avx(auVar30,auVar36);
        auVar36 = vsubps_avx(auVar38,auVar37);
        auVar37 = vsubps_avx(auVar34,auVar39);
        auVar35 = vsubps_avx(auVar35,auVar40);
        auVar38 = vminps_avx(auVar30,auVar36);
        auVar30 = vmaxps_avx(auVar30,auVar36);
        auVar34 = vminps_avx(auVar37,auVar35);
        auVar34 = vminps_avx(auVar38,auVar34);
        auVar38 = vmaxps_avx(auVar37,auVar35);
        auVar30 = vmaxps_avx(auVar30,auVar38);
        fVar200 = auVar41._0_4_;
        auVar187._0_4_ = fVar200 * auVar34._0_4_;
        auVar187._4_4_ = fVar200 * auVar34._4_4_;
        auVar187._8_4_ = fVar200 * auVar34._8_4_;
        auVar187._12_4_ = fVar200 * auVar34._12_4_;
        auVar203._0_4_ = fVar200 * auVar30._0_4_;
        auVar203._4_4_ = fVar200 * auVar30._4_4_;
        auVar203._8_4_ = fVar200 * auVar30._8_4_;
        auVar203._12_4_ = fVar200 * auVar30._12_4_;
        auVar90 = vinsertps_avx512f(local_338,auVar45,0x10);
        auVar36 = vinsertps_avx(auVar42,auVar46,0x10);
        auVar86._0_4_ = auVar90._0_4_ + auVar36._0_4_;
        auVar86._4_4_ = auVar90._4_4_ + auVar36._4_4_;
        auVar86._8_4_ = auVar90._8_4_ + auVar36._8_4_;
        auVar86._12_4_ = auVar90._12_4_ + auVar36._12_4_;
        auVar15._8_4_ = 0x3f000000;
        auVar15._0_8_ = 0x3f0000003f000000;
        auVar15._12_4_ = 0x3f000000;
        auVar44 = vmulps_avx512vl(auVar86,auVar15);
        auVar34 = vshufps_avx(auVar44,auVar44,0x54);
        uVar83 = auVar44._0_4_;
        auVar105._4_4_ = uVar83;
        auVar105._0_4_ = uVar83;
        auVar105._8_4_ = uVar83;
        auVar105._12_4_ = uVar83;
        auVar37 = vfmadd213ps_avx512vl(auVar236._0_16_,auVar105,auVar235._0_16_);
        auVar38 = vfmadd213ps_fma(auVar238._0_16_,auVar105,local_2d8);
        auVar35 = vfmadd213ps_fma(local_c8,auVar105,local_2e8);
        auVar30 = vsubps_avx(auVar38,auVar37);
        auVar37 = vfmadd213ps_fma(auVar30,auVar105,auVar37);
        auVar30 = vsubps_avx(auVar35,auVar38);
        auVar30 = vfmadd213ps_fma(auVar30,auVar105,auVar38);
        auVar30 = vsubps_avx(auVar30,auVar37);
        auVar38 = vfmadd231ps_fma(auVar37,auVar30,auVar105);
        auVar39 = vmulps_avx512vl(auVar30,auVar32);
        auVar212._8_8_ = auVar38._0_8_;
        auVar212._0_8_ = auVar38._0_8_;
        auVar30 = vshufpd_avx(auVar38,auVar38,3);
        auVar38 = vshufps_avx(auVar44,auVar44,0x55);
        auVar35 = vsubps_avx(auVar30,auVar212);
        auVar37 = vfmadd231ps_fma(auVar212,auVar38,auVar35);
        auVar226._8_8_ = auVar39._0_8_;
        auVar226._0_8_ = auVar39._0_8_;
        auVar30 = vshufpd_avx(auVar39,auVar39,3);
        auVar30 = vsubps_avx(auVar30,auVar226);
        auVar38 = vfmadd213ps_fma(auVar30,auVar38,auVar226);
        auVar106._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
        auVar106._8_4_ = auVar35._8_4_ ^ 0x80000000;
        auVar106._12_4_ = auVar35._12_4_ ^ 0x80000000;
        auVar30 = vmovshdup_avx(auVar38);
        auVar227._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
        auVar227._8_4_ = auVar30._8_4_ ^ 0x80000000;
        auVar227._12_4_ = auVar30._12_4_ ^ 0x80000000;
        auVar39 = vmovshdup_avx512vl(auVar35);
        auVar40 = vpermt2ps_avx512vl(auVar227,ZEXT416(5),auVar35);
        auVar30 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar30._0_4_ * auVar35._0_4_)),auVar38,auVar39
                                     );
        auVar38 = vpermt2ps_avx512vl(auVar38,SUB6416(ZEXT464(4),0),auVar106);
        auVar114._0_4_ = auVar30._0_4_;
        auVar114._4_4_ = auVar114._0_4_;
        auVar114._8_4_ = auVar114._0_4_;
        auVar114._12_4_ = auVar114._0_4_;
        auVar30 = vdivps_avx(auVar40,auVar114);
        auVar38 = vdivps_avx(auVar38,auVar114);
        fVar181 = auVar37._0_4_;
        auVar35 = vshufps_avx(auVar37,auVar37,0x55);
        fVar200 = auVar38._0_4_;
        auVar213._0_4_ = fVar181 * auVar30._0_4_ + auVar35._0_4_ * fVar200;
        auVar213._4_4_ = fVar181 * auVar30._4_4_ + auVar35._4_4_ * auVar38._4_4_;
        auVar213._8_4_ = fVar181 * auVar30._8_4_ + auVar35._8_4_ * auVar38._8_4_;
        auVar213._12_4_ = fVar181 * auVar30._12_4_ + auVar35._12_4_ * auVar38._12_4_;
        auVar48 = vsubps_avx(auVar34,auVar213);
        auVar37 = vmovshdup_avx(auVar30);
        auVar34 = vinsertps_avx(auVar167,auVar187,0x1c);
        auVar228._0_4_ = auVar37._0_4_ * auVar34._0_4_;
        auVar228._4_4_ = auVar37._4_4_ * auVar34._4_4_;
        auVar228._8_4_ = auVar37._8_4_ * auVar34._8_4_;
        auVar228._12_4_ = auVar37._12_4_ * auVar34._12_4_;
        auVar35 = vinsertps_avx(auVar154,auVar203,0x1c);
        auVar214._0_4_ = auVar37._0_4_ * auVar35._0_4_;
        auVar214._4_4_ = auVar37._4_4_ * auVar35._4_4_;
        auVar214._8_4_ = auVar37._8_4_ * auVar35._8_4_;
        auVar214._12_4_ = auVar37._12_4_ * auVar35._12_4_;
        auVar43 = vminps_avx512vl(auVar228,auVar214);
        auVar40 = vmaxps_avx(auVar214,auVar228);
        auVar41 = vmovshdup_avx(auVar38);
        auVar37 = vinsertps_avx(auVar187,auVar167,0x4c);
        auVar188._0_4_ = auVar41._0_4_ * auVar37._0_4_;
        auVar188._4_4_ = auVar41._4_4_ * auVar37._4_4_;
        auVar188._8_4_ = auVar41._8_4_ * auVar37._8_4_;
        auVar188._12_4_ = auVar41._12_4_ * auVar37._12_4_;
        auVar39 = vinsertps_avx(auVar203,auVar154,0x4c);
        auVar204._0_4_ = auVar41._0_4_ * auVar39._0_4_;
        auVar204._4_4_ = auVar41._4_4_ * auVar39._4_4_;
        auVar204._8_4_ = auVar41._8_4_ * auVar39._8_4_;
        auVar204._12_4_ = auVar41._12_4_ * auVar39._12_4_;
        auVar41 = vminps_avx(auVar188,auVar204);
        auVar43 = vaddps_avx512vl(auVar43,auVar41);
        auVar41 = vmaxps_avx(auVar204,auVar188);
        auVar189._0_4_ = auVar40._0_4_ + auVar41._0_4_;
        auVar189._4_4_ = auVar40._4_4_ + auVar41._4_4_;
        auVar189._8_4_ = auVar40._8_4_ + auVar41._8_4_;
        auVar189._12_4_ = auVar40._12_4_ + auVar41._12_4_;
        auVar205._8_8_ = 0x3f80000000000000;
        auVar205._0_8_ = 0x3f80000000000000;
        auVar40 = vsubps_avx(auVar205,auVar189);
        auVar41 = vsubps_avx(auVar205,auVar43);
        auVar43 = vsubps_avx(auVar90,auVar44);
        auVar44 = vsubps_avx(auVar36,auVar44);
        fVar198 = auVar43._0_4_;
        auVar229._0_4_ = fVar198 * auVar40._0_4_;
        fVar199 = auVar43._4_4_;
        auVar229._4_4_ = fVar199 * auVar40._4_4_;
        fVar148 = auVar43._8_4_;
        auVar229._8_4_ = fVar148 * auVar40._8_4_;
        fVar82 = auVar43._12_4_;
        auVar229._12_4_ = fVar82 * auVar40._12_4_;
        auVar47 = vbroadcastss_avx512vl(auVar30);
        auVar34 = vmulps_avx512vl(auVar47,auVar34);
        auVar35 = vmulps_avx512vl(auVar47,auVar35);
        auVar47 = vminps_avx512vl(auVar34,auVar35);
        auVar34 = vmaxps_avx(auVar35,auVar34);
        auVar168._0_4_ = fVar200 * auVar37._0_4_;
        auVar168._4_4_ = fVar200 * auVar37._4_4_;
        auVar168._8_4_ = fVar200 * auVar37._8_4_;
        auVar168._12_4_ = fVar200 * auVar37._12_4_;
        auVar155._0_4_ = fVar200 * auVar39._0_4_;
        auVar155._4_4_ = fVar200 * auVar39._4_4_;
        auVar155._8_4_ = fVar200 * auVar39._8_4_;
        auVar155._12_4_ = fVar200 * auVar39._12_4_;
        auVar35 = vminps_avx(auVar168,auVar155);
        auVar37 = vaddps_avx512vl(auVar47,auVar35);
        auVar39 = vmulps_avx512vl(auVar43,auVar41);
        fVar181 = auVar44._0_4_;
        auVar190._0_4_ = fVar181 * auVar40._0_4_;
        fVar193 = auVar44._4_4_;
        auVar190._4_4_ = fVar193 * auVar40._4_4_;
        fVar195 = auVar44._8_4_;
        auVar190._8_4_ = fVar195 * auVar40._8_4_;
        fVar197 = auVar44._12_4_;
        auVar190._12_4_ = fVar197 * auVar40._12_4_;
        auVar206._0_4_ = fVar181 * auVar41._0_4_;
        auVar206._4_4_ = fVar193 * auVar41._4_4_;
        auVar206._8_4_ = fVar195 * auVar41._8_4_;
        auVar206._12_4_ = fVar197 * auVar41._12_4_;
        auVar35 = vmaxps_avx(auVar155,auVar168);
        auVar156._0_4_ = auVar34._0_4_ + auVar35._0_4_;
        auVar156._4_4_ = auVar34._4_4_ + auVar35._4_4_;
        auVar156._8_4_ = auVar34._8_4_ + auVar35._8_4_;
        auVar156._12_4_ = auVar34._12_4_ + auVar35._12_4_;
        auVar169._8_8_ = 0x3f800000;
        auVar169._0_8_ = 0x3f800000;
        auVar34 = vsubps_avx(auVar169,auVar156);
        auVar35 = vsubps_avx(auVar169,auVar37);
        auVar221._0_4_ = fVar198 * auVar34._0_4_;
        auVar221._4_4_ = fVar199 * auVar34._4_4_;
        auVar221._8_4_ = fVar148 * auVar34._8_4_;
        auVar221._12_4_ = fVar82 * auVar34._12_4_;
        auVar215._0_4_ = fVar198 * auVar35._0_4_;
        auVar215._4_4_ = fVar199 * auVar35._4_4_;
        auVar215._8_4_ = fVar148 * auVar35._8_4_;
        auVar215._12_4_ = fVar82 * auVar35._12_4_;
        auVar157._0_4_ = fVar181 * auVar34._0_4_;
        auVar157._4_4_ = fVar193 * auVar34._4_4_;
        auVar157._8_4_ = fVar195 * auVar34._8_4_;
        auVar157._12_4_ = fVar197 * auVar34._12_4_;
        auVar170._0_4_ = fVar181 * auVar35._0_4_;
        auVar170._4_4_ = fVar193 * auVar35._4_4_;
        auVar170._8_4_ = fVar195 * auVar35._8_4_;
        auVar170._12_4_ = fVar197 * auVar35._12_4_;
        auVar34 = vminps_avx(auVar221,auVar215);
        auVar35 = vminps_avx(auVar157,auVar170);
        auVar37 = vminps_avx(auVar34,auVar35);
        auVar34 = vmaxps_avx(auVar215,auVar221);
        auVar35 = vmaxps_avx(auVar170,auVar157);
        auVar35 = vmaxps_avx(auVar35,auVar34);
        auVar40 = vminps_avx512vl(auVar229,auVar39);
        auVar34 = vminps_avx(auVar190,auVar206);
        auVar34 = vminps_avx(auVar40,auVar34);
        auVar34 = vhaddps_avx(auVar37,auVar34);
        auVar40 = vmaxps_avx512vl(auVar39,auVar229);
        auVar37 = vmaxps_avx(auVar206,auVar190);
        auVar37 = vmaxps_avx(auVar37,auVar40);
        auVar35 = vhaddps_avx(auVar35,auVar37);
        auVar34 = vshufps_avx(auVar34,auVar34,0xe8);
        auVar35 = vshufps_avx(auVar35,auVar35,0xe8);
        auVar158._0_4_ = auVar34._0_4_ + auVar48._0_4_;
        auVar158._4_4_ = auVar34._4_4_ + auVar48._4_4_;
        auVar158._8_4_ = auVar34._8_4_ + auVar48._8_4_;
        auVar158._12_4_ = auVar34._12_4_ + auVar48._12_4_;
        auVar171._0_4_ = auVar35._0_4_ + auVar48._0_4_;
        auVar171._4_4_ = auVar35._4_4_ + auVar48._4_4_;
        auVar171._8_4_ = auVar35._8_4_ + auVar48._8_4_;
        auVar171._12_4_ = auVar35._12_4_ + auVar48._12_4_;
        auVar34 = vmaxps_avx(auVar90,auVar158);
        auVar35 = vminps_avx(auVar171,auVar36);
        uVar21 = vcmpps_avx512vl(auVar35,auVar34,1);
        local_2f8 = vinsertps_avx(auVar45,auVar46,0x10);
        auVar230 = ZEXT1664(local_2f8);
        if ((uVar21 & 3) == 0) {
          vucomiss_avx512f(local_338);
          auVar34 = vxorps_avx512vl(auVar39,auVar39);
          in_ZMM16 = ZEXT1664(auVar34);
          auVar235 = ZEXT1664(local_348);
          if (uVar26 < 4 && (uVar5 == 0 || lVar25 == 0)) {
            bVar13 = false;
          }
          else {
            lVar25 = 200;
            do {
              auVar35 = vsubss_avx512f(auVar33,auVar48);
              fVar195 = auVar35._0_4_;
              fVar181 = fVar195 * fVar195 * fVar195;
              fVar197 = auVar48._0_4_;
              fVar193 = fVar197 * 3.0 * fVar195 * fVar195;
              fVar195 = fVar195 * fVar197 * fVar197 * 3.0;
              auVar136._4_4_ = fVar181;
              auVar136._0_4_ = fVar181;
              auVar136._8_4_ = fVar181;
              auVar136._12_4_ = fVar181;
              auVar125._4_4_ = fVar193;
              auVar125._0_4_ = fVar193;
              auVar125._8_4_ = fVar193;
              auVar125._12_4_ = fVar193;
              auVar99._4_4_ = fVar195;
              auVar99._0_4_ = fVar195;
              auVar99._8_4_ = fVar195;
              auVar99._12_4_ = fVar195;
              fVar197 = fVar197 * fVar197 * fVar197;
              auVar145._0_4_ = (float)local_1e8._0_4_ * fVar197;
              auVar145._4_4_ = (float)local_1e8._4_4_ * fVar197;
              auVar145._8_4_ = fStack_1e0 * fVar197;
              auVar145._12_4_ = fStack_1dc * fVar197;
              auVar35 = vfmadd231ps_fma(auVar145,local_2e8,auVar99);
              auVar35 = vfmadd231ps_fma(auVar35,local_2d8,auVar125);
              auVar35 = vfmadd231ps_avx512vl(auVar35,local_348,auVar136);
              auVar100._8_8_ = auVar35._0_8_;
              auVar100._0_8_ = auVar35._0_8_;
              auVar35 = vshufpd_avx(auVar35,auVar35,3);
              auVar36 = vshufps_avx(auVar48,auVar48,0x55);
              auVar35 = vsubps_avx(auVar35,auVar100);
              auVar36 = vfmadd213ps_fma(auVar35,auVar36,auVar100);
              fVar181 = auVar36._0_4_;
              auVar35 = vshufps_avx(auVar36,auVar36,0x55);
              auVar101._0_4_ = auVar30._0_4_ * fVar181 + fVar200 * auVar35._0_4_;
              auVar101._4_4_ = auVar30._4_4_ * fVar181 + auVar38._4_4_ * auVar35._4_4_;
              auVar101._8_4_ = auVar30._8_4_ * fVar181 + auVar38._8_4_ * auVar35._8_4_;
              auVar101._12_4_ = auVar30._12_4_ * fVar181 + auVar38._12_4_ * auVar35._12_4_;
              auVar48 = vsubps_avx(auVar48,auVar101);
              auVar35 = vandps_avx512vl(auVar36,auVar233._0_16_);
              auVar36 = vprolq_avx512vl(auVar35,0x20);
              auVar35 = vmaxss_avx(auVar36,auVar35);
              bVar10 = auVar35._0_4_ <= (float)local_1f8._0_4_;
              if (auVar35._0_4_ < (float)local_1f8._0_4_) {
                auVar30 = vucomiss_avx512f(auVar34);
                if (bVar10) {
                  auVar38 = vucomiss_avx512f(auVar30);
                  auVar232 = ZEXT1664(auVar38);
                  if (bVar10) {
                    vmovshdup_avx(auVar30);
                    auVar38 = vucomiss_avx512f(auVar34);
                    if (bVar10) {
                      auVar33 = vucomiss_avx512f(auVar38);
                      auVar232 = ZEXT1664(auVar33);
                      if (bVar10) {
                        auVar35 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar44 = vinsertps_avx(auVar35,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar1 = (ray->org).field_0;
                        auVar35 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                        auVar35 = vdpps_avx(auVar35,auVar44,0x7f);
                        auVar36 = vsubps_avx(local_248,(undefined1  [16])aVar1);
                        auVar36 = vdpps_avx(auVar36,auVar44,0x7f);
                        auVar37 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                        auVar37 = vdpps_avx(auVar37,auVar44,0x7f);
                        auVar39 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                        auVar39 = vdpps_avx(auVar39,auVar44,0x7f);
                        auVar40 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                        auVar40 = vdpps_avx(auVar40,auVar44,0x7f);
                        auVar41 = vsubps_avx(_local_268,(undefined1  [16])aVar1);
                        auVar41 = vdpps_avx(auVar41,auVar44,0x7f);
                        auVar43 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                        auVar43 = vdpps_avx(auVar43,auVar44,0x7f);
                        auVar48 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                        auVar44 = vdpps_avx(auVar48,auVar44,0x7f);
                        auVar48 = vsubss_avx512f(auVar33,auVar38);
                        fVar200 = auVar38._0_4_;
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * fVar200)),auVar48,
                                                  auVar35);
                        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar200)),auVar48,
                                                  auVar36);
                        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar200)),auVar48,
                                                  auVar37);
                        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar44._0_4_)),auVar48,
                                                  auVar39);
                        auVar33 = vsubss_avx512f(auVar33,auVar30);
                        auVar146._0_4_ = auVar33._0_4_;
                        fVar200 = auVar146._0_4_ * auVar146._0_4_ * auVar146._0_4_;
                        fVar195 = auVar30._0_4_;
                        fVar181 = fVar195 * 3.0 * auVar146._0_4_ * auVar146._0_4_;
                        fVar193 = auVar146._0_4_ * fVar195 * fVar195 * 3.0;
                        fVar198 = fVar195 * fVar195 * fVar195;
                        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar198 * auVar37._0_4_)),
                                                  ZEXT416((uint)fVar193),auVar36);
                        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar181),auVar35);
                        auVar38 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar200),auVar38);
                        fVar197 = auVar38._0_4_;
                        if (((ray->org).field_0.m128[3] <= fVar197) &&
                           (fVar199 = ray->tfar, fVar197 <= fVar199)) {
                          auVar38 = vshufps_avx(auVar30,auVar30,0x55);
                          auVar35 = vsubps_avx512vl(auVar31,auVar38);
                          fVar148 = auVar38._0_4_;
                          auVar178._0_4_ = fVar148 * (float)local_218._0_4_;
                          fVar82 = auVar38._4_4_;
                          auVar178._4_4_ = fVar82 * (float)local_218._4_4_;
                          fVar87 = auVar38._8_4_;
                          auVar178._8_4_ = fVar87 * fStack_210;
                          fVar88 = auVar38._12_4_;
                          auVar178._12_4_ = fVar88 * fStack_20c;
                          auVar191._0_4_ = fVar148 * (float)local_268._0_4_;
                          auVar191._4_4_ = fVar82 * (float)local_268._4_4_;
                          auVar191._8_4_ = fVar87 * fStack_260;
                          auVar191._12_4_ = fVar88 * fStack_25c;
                          auVar207._0_4_ = fVar148 * (float)local_278._0_4_;
                          auVar207._4_4_ = fVar82 * (float)local_278._4_4_;
                          auVar207._8_4_ = fVar87 * fStack_270;
                          auVar207._12_4_ = fVar88 * fStack_26c;
                          auVar159._0_4_ = fVar148 * (float)local_238._0_4_;
                          auVar159._4_4_ = fVar82 * (float)local_238._4_4_;
                          auVar159._8_4_ = fVar87 * fStack_230;
                          auVar159._12_4_ = fVar88 * fStack_22c;
                          auVar31 = vfmadd231ps_fma(auVar178,auVar35,local_208);
                          auVar38 = vfmadd231ps_fma(auVar191,auVar35,local_248);
                          auVar33 = vfmadd231ps_fma(auVar207,auVar35,local_258);
                          auVar35 = vfmadd231ps_fma(auVar159,auVar35,local_228);
                          auVar31 = vsubps_avx(auVar38,auVar31);
                          auVar38 = vsubps_avx(auVar33,auVar38);
                          auVar33 = vsubps_avx(auVar35,auVar33);
                          auVar208._0_4_ = fVar195 * auVar38._0_4_;
                          auVar208._4_4_ = fVar195 * auVar38._4_4_;
                          auVar208._8_4_ = fVar195 * auVar38._8_4_;
                          auVar208._12_4_ = fVar195 * auVar38._12_4_;
                          auVar146._4_4_ = auVar146._0_4_;
                          auVar146._8_4_ = auVar146._0_4_;
                          auVar146._12_4_ = auVar146._0_4_;
                          auVar31 = vfmadd231ps_fma(auVar208,auVar146,auVar31);
                          auVar160._0_4_ = fVar195 * auVar33._0_4_;
                          auVar160._4_4_ = fVar195 * auVar33._4_4_;
                          auVar160._8_4_ = fVar195 * auVar33._8_4_;
                          auVar160._12_4_ = fVar195 * auVar33._12_4_;
                          auVar38 = vfmadd231ps_fma(auVar160,auVar146,auVar38);
                          auVar161._0_4_ = fVar195 * auVar38._0_4_;
                          auVar161._4_4_ = fVar195 * auVar38._4_4_;
                          auVar161._8_4_ = fVar195 * auVar38._8_4_;
                          auVar161._12_4_ = fVar195 * auVar38._12_4_;
                          auVar31 = vfmadd231ps_fma(auVar161,auVar146,auVar31);
                          auVar31 = vmulps_avx512vl(auVar31,auVar32);
                          pGVar6 = (context->scene->geometries).items[uVar27].ptr;
                          if ((pGVar6->mask & ray->mask) == 0) {
                            bVar10 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar10 = true,
                                  pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar137._0_4_ = fVar198 * (float)local_118._0_4_;
                            auVar137._4_4_ = fVar198 * (float)local_118._4_4_;
                            auVar137._8_4_ = fVar198 * fStack_110;
                            auVar137._12_4_ = fVar198 * fStack_10c;
                            auVar126._4_4_ = fVar193;
                            auVar126._0_4_ = fVar193;
                            auVar126._8_4_ = fVar193;
                            auVar126._12_4_ = fVar193;
                            auVar32 = vfmadd132ps_fma(auVar126,auVar137,local_108);
                            auVar115._4_4_ = fVar181;
                            auVar115._0_4_ = fVar181;
                            auVar115._8_4_ = fVar181;
                            auVar115._12_4_ = fVar181;
                            auVar32 = vfmadd132ps_fma(auVar115,auVar32,local_f8);
                            auVar107._4_4_ = fVar200;
                            auVar107._0_4_ = fVar200;
                            auVar107._8_4_ = fVar200;
                            auVar107._12_4_ = fVar200;
                            auVar33 = vfmadd132ps_fma(auVar107,auVar32,local_e8);
                            auVar32 = vshufps_avx(auVar33,auVar33,0xc9);
                            auVar38 = vshufps_avx(auVar31,auVar31,0xc9);
                            auVar108._0_4_ = auVar33._0_4_ * auVar38._0_4_;
                            auVar108._4_4_ = auVar33._4_4_ * auVar38._4_4_;
                            auVar108._8_4_ = auVar33._8_4_ * auVar38._8_4_;
                            auVar108._12_4_ = auVar33._12_4_ * auVar38._12_4_;
                            auVar32 = vfmsub231ps_fma(auVar108,auVar31,auVar32);
                            auVar31 = vshufps_avx(auVar32,auVar32,0xe9);
                            local_148 = vmovlps_avx(auVar31);
                            local_140 = auVar32._0_4_;
                            local_13c = vmovlps_avx(auVar30);
                            local_134 = (int)local_2b8;
                            local_130 = uVar27;
                            local_12c = context->user->instID[0];
                            local_128 = context->user->instPrimID[0];
                            ray->tfar = fVar197;
                            local_34c = -1;
                            local_2a8.valid = &local_34c;
                            local_2a8.geometryUserPtr = pGVar6->userPtr;
                            local_2a8.context = context->user;
                            local_2a8.hit = (RTCHitN *)&local_148;
                            local_2a8.N = 1;
                            local_2a8.ray = (RTCRayN *)ray;
                            if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b3a766:
                              auVar30 = in_ZMM16._0_16_;
                              p_Var9 = context->args->filter;
                              if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var9)(&local_2a8);
                                  auVar230 = ZEXT1664(local_2f8);
                                  auVar238 = ZEXT1664(local_318);
                                  auVar236 = ZEXT1664(local_308);
                                  auVar235 = ZEXT1664(local_348);
                                  auVar30 = vxorps_avx512vl(auVar30,auVar30);
                                  in_ZMM16 = ZEXT1664(auVar30);
                                  auVar232 = ZEXT464(0x3f800000);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar231 = ZEXT3264(auVar66);
                                  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar237 = ZEXT1664(auVar30);
                                  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar234 = ZEXT1664(auVar30);
                                  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar233 = ZEXT1664(auVar30);
                                }
                                if (*local_2a8.valid == 0) goto LAB_01b3a8b6;
                              }
                              bVar10 = true;
                            }
                            else {
                              local_2c0 = context;
                              (*pGVar6->occlusionFilterN)(&local_2a8);
                              auVar230 = ZEXT1664(local_2f8);
                              auVar238 = ZEXT1664(local_318);
                              auVar236 = ZEXT1664(local_308);
                              auVar235 = ZEXT1664(local_348);
                              auVar30 = vxorps_avx512vl(auVar34,auVar34);
                              in_ZMM16 = ZEXT1664(auVar30);
                              auVar232 = ZEXT464(0x3f800000);
                              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar231 = ZEXT3264(auVar66);
                              auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar237 = ZEXT1664(auVar30);
                              auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar234 = ZEXT1664(auVar30);
                              auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar233 = ZEXT1664(auVar30);
                              context = local_2c0;
                              if (*local_2a8.valid != 0) goto LAB_01b3a766;
LAB_01b3a8b6:
                              bVar10 = false;
                            }
                            if (!bVar10) {
                              ray->tfar = fVar199;
                            }
                          }
                          bVar28 = (bool)(bVar28 | bVar10);
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar25 = lVar25 + -1;
            } while (lVar25 != 0);
          }
        }
        else {
          auVar30 = vxorps_avx512vl(auVar39,auVar39);
          in_ZMM16 = ZEXT1664(auVar30);
          auVar235 = ZEXT1664(local_348);
        }
      }
    } while (bVar13);
    auVar30 = vinsertps_avx(local_338,auVar42,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }